

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sandbox.cpp
# Opt level: O1

void __thiscall Sandbox::commandsInit(Sandbox *this,CommandList *_commands)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  string local_520;
  string local_500;
  string local_4e0;
  Command local_4c0;
  _Any_data local_438;
  code *local_428;
  code *pcStack_420;
  _Any_data local_418;
  code *local_408;
  code *pcStack_400;
  _Any_data local_3f8;
  code *local_3e8;
  code *pcStack_3e0;
  _Any_data local_3d8;
  code *local_3c8;
  code *pcStack_3c0;
  _Any_data local_3b8;
  code *local_3a8;
  code *pcStack_3a0;
  _Any_data local_398;
  code *local_388;
  code *pcStack_380;
  _Any_data local_378;
  code *local_368;
  code *pcStack_360;
  _Any_data local_358;
  code *local_348;
  code *pcStack_340;
  _Any_data local_338;
  code *local_328;
  code *pcStack_320;
  _Any_data local_318;
  code *local_308;
  code *pcStack_300;
  _Any_data local_2f8;
  code *local_2e8;
  code *pcStack_2e0;
  _Any_data local_2d8;
  code *local_2c8;
  code *pcStack_2c0;
  _Any_data local_2b8;
  code *local_2a8;
  code *pcStack_2a0;
  _Any_data local_298;
  code *local_288;
  code *pcStack_280;
  _Any_data local_278;
  code *local_268;
  code *pcStack_260;
  _Any_data local_258;
  code *local_248;
  code *pcStack_240;
  _Any_data local_238;
  code *local_228;
  code *pcStack_220;
  _Any_data local_218;
  code *local_208;
  code *pcStack_200;
  _Any_data local_1f8;
  code *local_1e8;
  code *pcStack_1e0;
  _Any_data local_1d8;
  code *local_1c8;
  code *pcStack_1c0;
  _Any_data local_1b8;
  code *local_1a8;
  code *pcStack_1a0;
  _Any_data local_198;
  code *local_188;
  code *pcStack_180;
  _Any_data local_178;
  code *local_168;
  code *pcStack_160;
  _Any_data local_158;
  code *local_148;
  code *pcStack_140;
  _Any_data local_138;
  code *local_128;
  code *pcStack_120;
  _Any_data local_118;
  code *local_108;
  code *pcStack_100;
  _Any_data local_f8;
  code *local_e8;
  code *pcStack_e0;
  _Any_data local_d8;
  code *local_c8;
  code *pcStack_c0;
  _Any_data local_b8;
  code *local_a8;
  code *pcStack_a0;
  _Any_data local_98;
  code *local_88;
  code *pcStack_80;
  _Any_data local_78;
  code *local_68;
  code *pcStack_60;
  _Any_data local_58;
  code *local_48;
  code *local_40;
  
  paVar1 = &local_4e0.field_2;
  local_4e0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4e0,"debug","");
  local_78._8_8_ = 0;
  pcStack_60 = std::
               _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/patriciogonzalezvivo[P]glslViewer/src/core/sandbox.cpp:168:42)>
               ::_M_invoke;
  local_68 = std::
             _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/patriciogonzalezvivo[P]glslViewer/src/core/sandbox.cpp:168:42)>
             ::_M_manager;
  paVar2 = &local_500.field_2;
  local_500._M_dataplus._M_p = (pointer)paVar2;
  local_78._M_unused._M_object = this;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_500,"debug[,on|off]","");
  paVar3 = &local_520.field_2;
  local_520._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_520,"show/hide debug elements or return the status of them","");
  Command::Command(&local_4c0,&local_4e0,
                   (function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                    *)&local_78,&local_500,&local_520,false);
  std::vector<Command,_std::allocator<Command>_>::emplace_back<Command>(_commands,&local_4c0);
  if (local_4c0.exec.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_4c0.exec.super__Function_base._M_manager)
              ((_Any_data *)&local_4c0.exec,(_Any_data *)&local_4c0.exec,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4c0.description._M_dataplus._M_p != &local_4c0.description.field_2) {
    operator_delete(local_4c0.description._M_dataplus._M_p,
                    local_4c0.description.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4c0.formula._M_dataplus._M_p != &local_4c0.formula.field_2) {
    operator_delete(local_4c0.formula._M_dataplus._M_p,
                    local_4c0.formula.field_2._M_allocated_capacity + 1);
  }
  paVar4 = &local_4c0.trigger.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4c0.trigger._M_dataplus._M_p != paVar4) {
    operator_delete(local_4c0.trigger._M_dataplus._M_p,
                    local_4c0.trigger.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_520._M_dataplus._M_p != paVar3) {
    operator_delete(local_520._M_dataplus._M_p,local_520.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_500._M_dataplus._M_p != paVar2) {
    operator_delete(local_500._M_dataplus._M_p,local_500.field_2._M_allocated_capacity + 1);
  }
  if (local_68 != (code *)0x0) {
    (*local_68)(&local_78,&local_78,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4e0._M_dataplus._M_p != paVar1) {
    operator_delete(local_4e0._M_dataplus._M_p,local_4e0.field_2._M_allocated_capacity + 1);
  }
  local_4e0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4e0,"track","");
  local_98._8_8_ = 0;
  pcStack_80 = std::
               _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/patriciogonzalezvivo[P]glslViewer/src/core/sandbox.cpp:215:42)>
               ::_M_invoke;
  local_88 = std::
             _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/patriciogonzalezvivo[P]glslViewer/src/core/sandbox.cpp:215:42)>
             ::_M_manager;
  local_500._M_dataplus._M_p = (pointer)paVar2;
  local_98._M_unused._M_object = this;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_500,"track[,on|off|average|samples]","");
  local_520._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_520,"start/stop tracking rendering time","");
  Command::Command(&local_4c0,&local_4e0,
                   (function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                    *)&local_98,&local_500,&local_520,false);
  std::vector<Command,_std::allocator<Command>_>::emplace_back<Command>(_commands,&local_4c0);
  if (local_4c0.exec.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_4c0.exec.super__Function_base._M_manager)
              ((_Any_data *)&local_4c0.exec,(_Any_data *)&local_4c0.exec,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4c0.description._M_dataplus._M_p != &local_4c0.description.field_2) {
    operator_delete(local_4c0.description._M_dataplus._M_p,
                    local_4c0.description.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4c0.formula._M_dataplus._M_p != &local_4c0.formula.field_2) {
    operator_delete(local_4c0.formula._M_dataplus._M_p,
                    local_4c0.formula.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4c0.trigger._M_dataplus._M_p != paVar4) {
    operator_delete(local_4c0.trigger._M_dataplus._M_p,
                    local_4c0.trigger.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_520._M_dataplus._M_p != paVar3) {
    operator_delete(local_520._M_dataplus._M_p,local_520.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_500._M_dataplus._M_p != paVar2) {
    operator_delete(local_500._M_dataplus._M_p,local_500.field_2._M_allocated_capacity + 1);
  }
  if (local_88 != (code *)0x0) {
    (*local_88)(&local_98,&local_98,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4e0._M_dataplus._M_p != paVar1) {
    operator_delete(local_4e0._M_dataplus._M_p,local_4e0.field_2._M_allocated_capacity + 1);
  }
  local_4e0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4e0,"glsl_version","");
  local_58._M_unused._M_object = (void *)0x0;
  local_58._8_8_ = 0;
  local_40 = std::
             _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/patriciogonzalezvivo[P]glslViewer/src/core/sandbox.cpp:288:49)>
             ::_M_invoke;
  local_48 = std::
             _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/patriciogonzalezvivo[P]glslViewer/src/core/sandbox.cpp:288:49)>
             ::_M_manager;
  local_500._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_500,"glsl_version","");
  local_520._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_520,"return GLSL Version","");
  Command::Command(&local_4c0,&local_4e0,
                   (function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                    *)&local_58,&local_500,&local_520,false);
  std::vector<Command,_std::allocator<Command>_>::emplace_back<Command>(_commands,&local_4c0);
  if (local_4c0.exec.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_4c0.exec.super__Function_base._M_manager)
              ((_Any_data *)&local_4c0.exec,(_Any_data *)&local_4c0.exec,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4c0.description._M_dataplus._M_p != &local_4c0.description.field_2) {
    operator_delete(local_4c0.description._M_dataplus._M_p,
                    local_4c0.description.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4c0.formula._M_dataplus._M_p != &local_4c0.formula.field_2) {
    operator_delete(local_4c0.formula._M_dataplus._M_p,
                    local_4c0.formula.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4c0.trigger._M_dataplus._M_p != paVar4) {
    operator_delete(local_4c0.trigger._M_dataplus._M_p,
                    local_4c0.trigger.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_520._M_dataplus._M_p != paVar3) {
    operator_delete(local_520._M_dataplus._M_p,local_520.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_500._M_dataplus._M_p != paVar2) {
    operator_delete(local_500._M_dataplus._M_p,local_500.field_2._M_allocated_capacity + 1);
  }
  if (local_48 != (code *)0x0) {
    (*local_48)(&local_58,&local_58,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4e0._M_dataplus._M_p != paVar1) {
    operator_delete(local_4e0._M_dataplus._M_p,local_4e0.field_2._M_allocated_capacity + 1);
  }
  local_4e0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4e0,"error_screen","");
  local_b8._8_8_ = 0;
  pcStack_a0 = std::
               _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/patriciogonzalezvivo[P]glslViewer/src/core/sandbox.cpp:298:49)>
               ::_M_invoke;
  local_a8 = std::
             _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/patriciogonzalezvivo[P]glslViewer/src/core/sandbox.cpp:298:49)>
             ::_M_manager;
  local_500._M_dataplus._M_p = (pointer)paVar2;
  local_b8._M_unused._M_object = this;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_500,"error_screen,on|off","");
  local_520._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_520,"enable/disable magenta screen on errors","");
  Command::Command(&local_4c0,&local_4e0,
                   (function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                    *)&local_b8,&local_500,&local_520,false);
  std::vector<Command,_std::allocator<Command>_>::emplace_back<Command>(_commands,&local_4c0);
  if (local_4c0.exec.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_4c0.exec.super__Function_base._M_manager)
              ((_Any_data *)&local_4c0.exec,(_Any_data *)&local_4c0.exec,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4c0.description._M_dataplus._M_p != &local_4c0.description.field_2) {
    operator_delete(local_4c0.description._M_dataplus._M_p,
                    local_4c0.description.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4c0.formula._M_dataplus._M_p != &local_4c0.formula.field_2) {
    operator_delete(local_4c0.formula._M_dataplus._M_p,
                    local_4c0.formula.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4c0.trigger._M_dataplus._M_p != paVar4) {
    operator_delete(local_4c0.trigger._M_dataplus._M_p,
                    local_4c0.trigger.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_520._M_dataplus._M_p != paVar3) {
    operator_delete(local_520._M_dataplus._M_p,local_520.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_500._M_dataplus._M_p != paVar2) {
    operator_delete(local_500._M_dataplus._M_p,local_500.field_2._M_allocated_capacity + 1);
  }
  if (local_a8 != (code *)0x0) {
    (*local_a8)(&local_b8,&local_b8,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4e0._M_dataplus._M_p != paVar1) {
    operator_delete(local_4e0._M_dataplus._M_p,local_4e0.field_2._M_allocated_capacity + 1);
  }
  local_4e0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4e0,"plot","");
  local_d8._8_8_ = 0;
  pcStack_c0 = std::
               _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/patriciogonzalezvivo[P]glslViewer/src/core/sandbox.cpp:315:41)>
               ::_M_invoke;
  local_c8 = std::
             _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/patriciogonzalezvivo[P]glslViewer/src/core/sandbox.cpp:315:41)>
             ::_M_manager;
  local_500._M_dataplus._M_p = (pointer)paVar2;
  local_d8._M_unused._M_object = this;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_500,"plot[,off|luma|red|green|blue|rgb|fps|ms]","");
  local_520._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_520,"show/hide a histogram or FPS plot on screen","");
  Command::Command(&local_4c0,&local_4e0,
                   (function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                    *)&local_d8,&local_500,&local_520,false);
  std::vector<Command,_std::allocator<Command>_>::emplace_back<Command>(_commands,&local_4c0);
  if (local_4c0.exec.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_4c0.exec.super__Function_base._M_manager)
              ((_Any_data *)&local_4c0.exec,(_Any_data *)&local_4c0.exec,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4c0.description._M_dataplus._M_p != &local_4c0.description.field_2) {
    operator_delete(local_4c0.description._M_dataplus._M_p,
                    local_4c0.description.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4c0.formula._M_dataplus._M_p != &local_4c0.formula.field_2) {
    operator_delete(local_4c0.formula._M_dataplus._M_p,
                    local_4c0.formula.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4c0.trigger._M_dataplus._M_p != paVar4) {
    operator_delete(local_4c0.trigger._M_dataplus._M_p,
                    local_4c0.trigger.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_520._M_dataplus._M_p != paVar3) {
    operator_delete(local_520._M_dataplus._M_p,local_520.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_500._M_dataplus._M_p != paVar2) {
    operator_delete(local_500._M_dataplus._M_p,local_500.field_2._M_allocated_capacity + 1);
  }
  if (local_c8 != (code *)0x0) {
    (*local_c8)(&local_d8,&local_d8,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4e0._M_dataplus._M_p != paVar1) {
    operator_delete(local_4e0._M_dataplus._M_p,local_4e0.field_2._M_allocated_capacity + 1);
  }
  local_4e0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4e0,"reset","");
  local_f8._8_8_ = 0;
  pcStack_e0 = std::
               _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/patriciogonzalezvivo[P]glslViewer/src/core/sandbox.cpp:365:42)>
               ::_M_invoke;
  local_e8 = std::
             _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/patriciogonzalezvivo[P]glslViewer/src/core/sandbox.cpp:365:42)>
             ::_M_manager;
  local_500._M_dataplus._M_p = (pointer)paVar2;
  local_f8._M_unused._M_object = this;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_500,"reset","");
  local_520._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_520,"reset timestamp back to zero","");
  Command::Command(&local_4c0,&local_4e0,
                   (function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                    *)&local_f8,&local_500,&local_520,false);
  std::vector<Command,_std::allocator<Command>_>::emplace_back<Command>(_commands,&local_4c0);
  if (local_4c0.exec.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_4c0.exec.super__Function_base._M_manager)
              ((_Any_data *)&local_4c0.exec,(_Any_data *)&local_4c0.exec,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4c0.description._M_dataplus._M_p != &local_4c0.description.field_2) {
    operator_delete(local_4c0.description._M_dataplus._M_p,
                    local_4c0.description.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4c0.formula._M_dataplus._M_p != &local_4c0.formula.field_2) {
    operator_delete(local_4c0.formula._M_dataplus._M_p,
                    local_4c0.formula.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4c0.trigger._M_dataplus._M_p != paVar4) {
    operator_delete(local_4c0.trigger._M_dataplus._M_p,
                    local_4c0.trigger.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_520._M_dataplus._M_p != paVar3) {
    operator_delete(local_520._M_dataplus._M_p,local_520.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_500._M_dataplus._M_p != paVar2) {
    operator_delete(local_500._M_dataplus._M_p,local_500.field_2._M_allocated_capacity + 1);
  }
  if (local_e8 != (code *)0x0) {
    (*local_e8)(&local_f8,&local_f8,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4e0._M_dataplus._M_p != paVar1) {
    operator_delete(local_4e0._M_dataplus._M_p,local_4e0.field_2._M_allocated_capacity + 1);
  }
  local_4e0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4e0,"time","");
  local_118._8_8_ = 0;
  pcStack_100 = std::
                _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/patriciogonzalezvivo[P]glslViewer/src/core/sandbox.cpp:374:41)>
                ::_M_invoke;
  local_108 = std::
              _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/patriciogonzalezvivo[P]glslViewer/src/core/sandbox.cpp:374:41)>
              ::_M_manager;
  local_500._M_dataplus._M_p = (pointer)paVar2;
  local_118._M_unused._M_object = this;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_500,"time","");
  local_520._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_520,"return u_time, the elapsed time.","");
  Command::Command(&local_4c0,&local_4e0,
                   (function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                    *)&local_118,&local_500,&local_520,false);
  std::vector<Command,_std::allocator<Command>_>::emplace_back<Command>(_commands,&local_4c0);
  if (local_4c0.exec.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_4c0.exec.super__Function_base._M_manager)
              ((_Any_data *)&local_4c0.exec,(_Any_data *)&local_4c0.exec,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4c0.description._M_dataplus._M_p != &local_4c0.description.field_2) {
    operator_delete(local_4c0.description._M_dataplus._M_p,
                    local_4c0.description.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4c0.formula._M_dataplus._M_p != &local_4c0.formula.field_2) {
    operator_delete(local_4c0.formula._M_dataplus._M_p,
                    local_4c0.formula.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4c0.trigger._M_dataplus._M_p != paVar4) {
    operator_delete(local_4c0.trigger._M_dataplus._M_p,
                    local_4c0.trigger.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_520._M_dataplus._M_p != paVar3) {
    operator_delete(local_520._M_dataplus._M_p,local_520.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_500._M_dataplus._M_p != paVar2) {
    operator_delete(local_500._M_dataplus._M_p,local_500.field_2._M_allocated_capacity + 1);
  }
  if (local_108 != (code *)0x0) {
    (*local_108)(&local_118,&local_118,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4e0._M_dataplus._M_p != paVar1) {
    operator_delete(local_4e0._M_dataplus._M_p,local_4e0.field_2._M_allocated_capacity + 1);
  }
  local_4e0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4e0,"defines","");
  local_138._8_8_ = 0;
  pcStack_120 = std::
                _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/patriciogonzalezvivo[P]glslViewer/src/core/sandbox.cpp:384:44)>
                ::_M_invoke;
  local_128 = std::
              _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/patriciogonzalezvivo[P]glslViewer/src/core/sandbox.cpp:384:44)>
              ::_M_manager;
  local_500._M_dataplus._M_p = (pointer)paVar2;
  local_138._M_unused._M_object = this;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_500,"defines","");
  local_520._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_520,"return a list of active defines","");
  Command::Command(&local_4c0,&local_4e0,
                   (function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                    *)&local_138,&local_500,&local_520,false);
  std::vector<Command,_std::allocator<Command>_>::emplace_back<Command>(_commands,&local_4c0);
  if (local_4c0.exec.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_4c0.exec.super__Function_base._M_manager)
              ((_Any_data *)&local_4c0.exec,(_Any_data *)&local_4c0.exec,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4c0.description._M_dataplus._M_p != &local_4c0.description.field_2) {
    operator_delete(local_4c0.description._M_dataplus._M_p,
                    local_4c0.description.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4c0.formula._M_dataplus._M_p != &local_4c0.formula.field_2) {
    operator_delete(local_4c0.formula._M_dataplus._M_p,
                    local_4c0.formula.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4c0.trigger._M_dataplus._M_p != paVar4) {
    operator_delete(local_4c0.trigger._M_dataplus._M_p,
                    local_4c0.trigger.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_520._M_dataplus._M_p != paVar3) {
    operator_delete(local_520._M_dataplus._M_p,local_520.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_500._M_dataplus._M_p != paVar2) {
    operator_delete(local_500._M_dataplus._M_p,local_500.field_2._M_allocated_capacity + 1);
  }
  if (local_128 != (code *)0x0) {
    (*local_128)(&local_138,&local_138,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4e0._M_dataplus._M_p != paVar1) {
    operator_delete(local_4e0._M_dataplus._M_p,local_4e0.field_2._M_allocated_capacity + 1);
  }
  local_4e0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4e0,"uniforms","");
  local_158._8_8_ = 0;
  pcStack_140 = std::
                _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/patriciogonzalezvivo[P]glslViewer/src/core/sandbox.cpp:399:45)>
                ::_M_invoke;
  local_148 = std::
              _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/patriciogonzalezvivo[P]glslViewer/src/core/sandbox.cpp:399:45)>
              ::_M_manager;
  local_500._M_dataplus._M_p = (pointer)paVar2;
  local_158._M_unused._M_object = this;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_500,
             "uniforms[,all|active|defined|textures|buffers|cubemaps|lights|cameras|on|off]","");
  local_520._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_520,"return a list of uniforms","");
  Command::Command(&local_4c0,&local_4e0,
                   (function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                    *)&local_158,&local_500,&local_520,false);
  std::vector<Command,_std::allocator<Command>_>::emplace_back<Command>(_commands,&local_4c0);
  if (local_4c0.exec.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_4c0.exec.super__Function_base._M_manager)
              ((_Any_data *)&local_4c0.exec,(_Any_data *)&local_4c0.exec,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4c0.description._M_dataplus._M_p != &local_4c0.description.field_2) {
    operator_delete(local_4c0.description._M_dataplus._M_p,
                    local_4c0.description.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4c0.formula._M_dataplus._M_p != &local_4c0.formula.field_2) {
    operator_delete(local_4c0.formula._M_dataplus._M_p,
                    local_4c0.formula.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4c0.trigger._M_dataplus._M_p != paVar4) {
    operator_delete(local_4c0.trigger._M_dataplus._M_p,
                    local_4c0.trigger.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_520._M_dataplus._M_p != paVar3) {
    operator_delete(local_520._M_dataplus._M_p,local_520.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_500._M_dataplus._M_p != paVar2) {
    operator_delete(local_500._M_dataplus._M_p,local_500.field_2._M_allocated_capacity + 1);
  }
  if (local_148 != (code *)0x0) {
    (*local_148)(&local_158,&local_158,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4e0._M_dataplus._M_p != paVar1) {
    operator_delete(local_4e0._M_dataplus._M_p,local_4e0.field_2._M_allocated_capacity + 1);
  }
  local_4e0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4e0,"textures","");
  local_178._8_8_ = 0;
  pcStack_160 = std::
                _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/patriciogonzalezvivo[P]glslViewer/src/core/sandbox.cpp:468:45)>
                ::_M_invoke;
  local_168 = std::
              _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/patriciogonzalezvivo[P]glslViewer/src/core/sandbox.cpp:468:45)>
              ::_M_manager;
  local_500._M_dataplus._M_p = (pointer)paVar2;
  local_178._M_unused._M_object = this;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_500,"textures[,on|off]","");
  local_520._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_520,
             "return a list of textures as their uniform name and path. Or show/hide textures on viewport."
             ,"");
  Command::Command(&local_4c0,&local_4e0,
                   (function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                    *)&local_178,&local_500,&local_520,false);
  std::vector<Command,_std::allocator<Command>_>::emplace_back<Command>(_commands,&local_4c0);
  if (local_4c0.exec.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_4c0.exec.super__Function_base._M_manager)
              ((_Any_data *)&local_4c0.exec,(_Any_data *)&local_4c0.exec,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4c0.description._M_dataplus._M_p != &local_4c0.description.field_2) {
    operator_delete(local_4c0.description._M_dataplus._M_p,
                    local_4c0.description.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4c0.formula._M_dataplus._M_p != &local_4c0.formula.field_2) {
    operator_delete(local_4c0.formula._M_dataplus._M_p,
                    local_4c0.formula.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4c0.trigger._M_dataplus._M_p != paVar4) {
    operator_delete(local_4c0.trigger._M_dataplus._M_p,
                    local_4c0.trigger.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_520._M_dataplus._M_p != paVar3) {
    operator_delete(local_520._M_dataplus._M_p,local_520.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_500._M_dataplus._M_p != paVar2) {
    operator_delete(local_500._M_dataplus._M_p,local_500.field_2._M_allocated_capacity + 1);
  }
  if (local_168 != (code *)0x0) {
    (*local_168)(&local_178,&local_178,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4e0._M_dataplus._M_p != paVar1) {
    operator_delete(local_4e0._M_dataplus._M_p,local_4e0.field_2._M_allocated_capacity + 1);
  }
  local_4e0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4e0,"buffer","");
  local_198._8_8_ = 0;
  pcStack_180 = std::
                _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/patriciogonzalezvivo[P]glslViewer/src/core/sandbox.cpp:488:43)>
                ::_M_invoke;
  local_188 = std::
              _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/patriciogonzalezvivo[P]glslViewer/src/core/sandbox.cpp:488:43)>
              ::_M_manager;
  local_500._M_dataplus._M_p = (pointer)paVar2;
  local_198._M_unused._M_object = this;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_500,"buffers[,show|hide]","");
  local_520._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_520,
             "return a list of buffers as their uniform name. Or show/hide buffer on viewport.","");
  Command::Command(&local_4c0,&local_4e0,
                   (function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                    *)&local_198,&local_500,&local_520,false);
  std::vector<Command,_std::allocator<Command>_>::emplace_back<Command>(_commands,&local_4c0);
  if (local_4c0.exec.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_4c0.exec.super__Function_base._M_manager)
              ((_Any_data *)&local_4c0.exec,(_Any_data *)&local_4c0.exec,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4c0.description._M_dataplus._M_p != &local_4c0.description.field_2) {
    operator_delete(local_4c0.description._M_dataplus._M_p,
                    local_4c0.description.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4c0.formula._M_dataplus._M_p != &local_4c0.formula.field_2) {
    operator_delete(local_4c0.formula._M_dataplus._M_p,
                    local_4c0.formula.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4c0.trigger._M_dataplus._M_p != paVar4) {
    operator_delete(local_4c0.trigger._M_dataplus._M_p,
                    local_4c0.trigger.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_520._M_dataplus._M_p != paVar3) {
    operator_delete(local_520._M_dataplus._M_p,local_520.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_500._M_dataplus._M_p != paVar2) {
    operator_delete(local_500._M_dataplus._M_p,local_500.field_2._M_allocated_capacity + 1);
  }
  if (local_188 != (code *)0x0) {
    (*local_188)(&local_198,&local_198,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4e0._M_dataplus._M_p != paVar1) {
    operator_delete(local_4e0._M_dataplus._M_p,local_4e0.field_2._M_allocated_capacity + 1);
  }
  local_4e0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4e0,"cubemaps","");
  local_1b8._8_8_ = 0;
  pcStack_1a0 = std::
                _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/patriciogonzalezvivo[P]glslViewer/src/core/sandbox.cpp:526:45)>
                ::_M_invoke;
  local_1a8 = std::
              _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/patriciogonzalezvivo[P]glslViewer/src/core/sandbox.cpp:526:45)>
              ::_M_manager;
  local_500._M_dataplus._M_p = (pointer)paVar2;
  local_1b8._M_unused._M_object = this;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_500,"cubemaps","");
  local_520._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_520,"print all cubemaps","");
  Command::Command(&local_4c0,&local_4e0,
                   (function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                    *)&local_1b8,&local_500,&local_520,true);
  std::vector<Command,_std::allocator<Command>_>::emplace_back<Command>(_commands,&local_4c0);
  if (local_4c0.exec.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_4c0.exec.super__Function_base._M_manager)
              ((_Any_data *)&local_4c0.exec,(_Any_data *)&local_4c0.exec,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4c0.description._M_dataplus._M_p != &local_4c0.description.field_2) {
    operator_delete(local_4c0.description._M_dataplus._M_p,
                    local_4c0.description.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4c0.formula._M_dataplus._M_p != &local_4c0.formula.field_2) {
    operator_delete(local_4c0.formula._M_dataplus._M_p,
                    local_4c0.formula.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4c0.trigger._M_dataplus._M_p != paVar4) {
    operator_delete(local_4c0.trigger._M_dataplus._M_p,
                    local_4c0.trigger.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_520._M_dataplus._M_p != paVar3) {
    operator_delete(local_520._M_dataplus._M_p,local_520.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_500._M_dataplus._M_p != paVar2) {
    operator_delete(local_500._M_dataplus._M_p,local_500.field_2._M_allocated_capacity + 1);
  }
  if (local_1a8 != (code *)0x0) {
    (*local_1a8)(&local_1b8,&local_1b8,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4e0._M_dataplus._M_p != paVar1) {
    operator_delete(local_4e0._M_dataplus._M_p,local_4e0.field_2._M_allocated_capacity + 1);
  }
  local_4e0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4e0,"cubemap","");
  local_1d8._8_8_ = 0;
  pcStack_1c0 = std::
                _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/patriciogonzalezvivo[P]glslViewer/src/core/sandbox.cpp:535:44)>
                ::_M_invoke;
  local_1c8 = std::
              _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/patriciogonzalezvivo[P]glslViewer/src/core/sandbox.cpp:535:44)>
              ::_M_manager;
  local_500._M_dataplus._M_p = (pointer)paVar2;
  local_1d8._M_unused._M_object = this;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_500,"cubemap[,on|off|toggle|sh]","");
  local_520._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_520,"show/hide cubemap or return the spherical harmonics of it","");
  Command::Command(&local_4c0,&local_4e0,
                   (function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                    *)&local_1d8,&local_500,&local_520,true);
  std::vector<Command,_std::allocator<Command>_>::emplace_back<Command>(_commands,&local_4c0);
  if (local_4c0.exec.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_4c0.exec.super__Function_base._M_manager)
              ((_Any_data *)&local_4c0.exec,(_Any_data *)&local_4c0.exec,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4c0.description._M_dataplus._M_p != &local_4c0.description.field_2) {
    operator_delete(local_4c0.description._M_dataplus._M_p,
                    local_4c0.description.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4c0.formula._M_dataplus._M_p != &local_4c0.formula.field_2) {
    operator_delete(local_4c0.formula._M_dataplus._M_p,
                    local_4c0.formula.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4c0.trigger._M_dataplus._M_p != paVar4) {
    operator_delete(local_4c0.trigger._M_dataplus._M_p,
                    local_4c0.trigger.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_520._M_dataplus._M_p != paVar3) {
    operator_delete(local_520._M_dataplus._M_p,local_520.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_500._M_dataplus._M_p != paVar2) {
    operator_delete(local_500._M_dataplus._M_p,local_500.field_2._M_allocated_capacity + 1);
  }
  if (local_1c8 != (code *)0x0) {
    (*local_1c8)(&local_1d8,&local_1d8,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4e0._M_dataplus._M_p != paVar1) {
    operator_delete(local_4e0._M_dataplus._M_p,local_4e0.field_2._M_allocated_capacity + 1);
  }
  local_4e0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4e0,"sky","");
  local_1f8._8_8_ = 0;
  pcStack_1e0 = std::
                _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/patriciogonzalezvivo[P]glslViewer/src/core/sandbox.cpp:570:40)>
                ::_M_invoke;
  local_1e8 = std::
              _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/patriciogonzalezvivo[P]glslViewer/src/core/sandbox.cpp:570:40)>
              ::_M_manager;
  local_500._M_dataplus._M_p = (pointer)paVar2;
  local_1f8._M_unused._M_object = this;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_500,"sky[,on|off]","");
  local_520._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_520,"show/hide skybox","");
  Command::Command(&local_4c0,&local_4e0,
                   (function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                    *)&local_1f8,&local_500,&local_520,true);
  std::vector<Command,_std::allocator<Command>_>::emplace_back<Command>(_commands,&local_4c0);
  if (local_4c0.exec.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_4c0.exec.super__Function_base._M_manager)
              ((_Any_data *)&local_4c0.exec,(_Any_data *)&local_4c0.exec,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4c0.description._M_dataplus._M_p != &local_4c0.description.field_2) {
    operator_delete(local_4c0.description._M_dataplus._M_p,
                    local_4c0.description.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4c0.formula._M_dataplus._M_p != &local_4c0.formula.field_2) {
    operator_delete(local_4c0.formula._M_dataplus._M_p,
                    local_4c0.formula.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4c0.trigger._M_dataplus._M_p != paVar4) {
    operator_delete(local_4c0.trigger._M_dataplus._M_p,
                    local_4c0.trigger.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_520._M_dataplus._M_p != paVar3) {
    operator_delete(local_520._M_dataplus._M_p,local_520.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_500._M_dataplus._M_p != paVar2) {
    operator_delete(local_500._M_dataplus._M_p,local_500.field_2._M_allocated_capacity + 1);
  }
  if (local_1e8 != (code *)0x0) {
    (*local_1e8)(&local_1f8,&local_1f8,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4e0._M_dataplus._M_p != paVar1) {
    operator_delete(local_4e0._M_dataplus._M_p,local_4e0.field_2._M_allocated_capacity + 1);
  }
  local_4e0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4e0,"sun_elevation","");
  local_218._8_8_ = 0;
  pcStack_200 = std::
                _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/patriciogonzalezvivo[P]glslViewer/src/core/sandbox.cpp:599:50)>
                ::_M_invoke;
  local_208 = std::
              _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/patriciogonzalezvivo[P]glslViewer/src/core/sandbox.cpp:599:50)>
              ::_M_manager;
  local_500._M_dataplus._M_p = (pointer)paVar2;
  local_218._M_unused._M_object = this;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_500,"sun_elevation[,<degrees>]","");
  local_520._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_520,"get or set the sun elevation in degrees (remember to skybox,on)."
             ,"");
  Command::Command(&local_4c0,&local_4e0,
                   (function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                    *)&local_218,&local_500,&local_520,true);
  std::vector<Command,_std::allocator<Command>_>::emplace_back<Command>(_commands,&local_4c0);
  if (local_4c0.exec.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_4c0.exec.super__Function_base._M_manager)
              ((_Any_data *)&local_4c0.exec,(_Any_data *)&local_4c0.exec,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4c0.description._M_dataplus._M_p != &local_4c0.description.field_2) {
    operator_delete(local_4c0.description._M_dataplus._M_p,
                    local_4c0.description.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4c0.formula._M_dataplus._M_p != &local_4c0.formula.field_2) {
    operator_delete(local_4c0.formula._M_dataplus._M_p,
                    local_4c0.formula.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4c0.trigger._M_dataplus._M_p != paVar4) {
    operator_delete(local_4c0.trigger._M_dataplus._M_p,
                    local_4c0.trigger.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_520._M_dataplus._M_p != paVar3) {
    operator_delete(local_520._M_dataplus._M_p,local_520.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_500._M_dataplus._M_p != paVar2) {
    operator_delete(local_500._M_dataplus._M_p,local_500.field_2._M_allocated_capacity + 1);
  }
  if (local_208 != (code *)0x0) {
    (*local_208)(&local_218,&local_218,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4e0._M_dataplus._M_p != paVar1) {
    operator_delete(local_4e0._M_dataplus._M_p,local_4e0.field_2._M_allocated_capacity + 1);
  }
  local_4e0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4e0,"sun_azimuth","");
  local_238._8_8_ = 0;
  pcStack_220 = std::
                _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/patriciogonzalezvivo[P]glslViewer/src/core/sandbox.cpp:621:48)>
                ::_M_invoke;
  local_228 = std::
              _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/patriciogonzalezvivo[P]glslViewer/src/core/sandbox.cpp:621:48)>
              ::_M_manager;
  local_500._M_dataplus._M_p = (pointer)paVar2;
  local_238._M_unused._M_object = this;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_500,"sun_azimuth[,<degrees>]","")
  ;
  local_520._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_520,"get or set the sun azimuth in degrees (remember to skybox,on).",
             "");
  Command::Command(&local_4c0,&local_4e0,
                   (function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                    *)&local_238,&local_500,&local_520,true);
  std::vector<Command,_std::allocator<Command>_>::emplace_back<Command>(_commands,&local_4c0);
  if (local_4c0.exec.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_4c0.exec.super__Function_base._M_manager)
              ((_Any_data *)&local_4c0.exec,(_Any_data *)&local_4c0.exec,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4c0.description._M_dataplus._M_p != &local_4c0.description.field_2) {
    operator_delete(local_4c0.description._M_dataplus._M_p,
                    local_4c0.description.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4c0.formula._M_dataplus._M_p != &local_4c0.formula.field_2) {
    operator_delete(local_4c0.formula._M_dataplus._M_p,
                    local_4c0.formula.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4c0.trigger._M_dataplus._M_p != paVar4) {
    operator_delete(local_4c0.trigger._M_dataplus._M_p,
                    local_4c0.trigger.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_520._M_dataplus._M_p != paVar3) {
    operator_delete(local_520._M_dataplus._M_p,local_520.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_500._M_dataplus._M_p != paVar2) {
    operator_delete(local_500._M_dataplus._M_p,local_500.field_2._M_allocated_capacity + 1);
  }
  if (local_228 != (code *)0x0) {
    (*local_228)(&local_238,&local_238,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4e0._M_dataplus._M_p != paVar1) {
    operator_delete(local_4e0._M_dataplus._M_p,local_4e0.field_2._M_allocated_capacity + 1);
  }
  local_4e0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4e0,"sky_turbidity","");
  local_258._8_8_ = 0;
  pcStack_240 = std::
                _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/patriciogonzalezvivo[P]glslViewer/src/core/sandbox.cpp:644:50)>
                ::_M_invoke;
  local_248 = std::
              _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/patriciogonzalezvivo[P]glslViewer/src/core/sandbox.cpp:644:50)>
              ::_M_manager;
  local_500._M_dataplus._M_p = (pointer)paVar2;
  local_258._M_unused._M_object = this;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_500,"sky_turbidity[,<sky_turbidty>]","");
  local_520._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_520,"get or set the sky turbidity.","");
  Command::Command(&local_4c0,&local_4e0,
                   (function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                    *)&local_258,&local_500,&local_520,true);
  std::vector<Command,_std::allocator<Command>_>::emplace_back<Command>(_commands,&local_4c0);
  if (local_4c0.exec.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_4c0.exec.super__Function_base._M_manager)
              ((_Any_data *)&local_4c0.exec,(_Any_data *)&local_4c0.exec,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4c0.description._M_dataplus._M_p != &local_4c0.description.field_2) {
    operator_delete(local_4c0.description._M_dataplus._M_p,
                    local_4c0.description.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4c0.formula._M_dataplus._M_p != &local_4c0.formula.field_2) {
    operator_delete(local_4c0.formula._M_dataplus._M_p,
                    local_4c0.formula.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4c0.trigger._M_dataplus._M_p != paVar4) {
    operator_delete(local_4c0.trigger._M_dataplus._M_p,
                    local_4c0.trigger.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_520._M_dataplus._M_p != paVar3) {
    operator_delete(local_520._M_dataplus._M_p,local_520.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_500._M_dataplus._M_p != paVar2) {
    operator_delete(local_500._M_dataplus._M_p,local_500.field_2._M_allocated_capacity + 1);
  }
  if (local_248 != (code *)0x0) {
    (*local_248)(&local_258,&local_258,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4e0._M_dataplus._M_p != paVar1) {
    operator_delete(local_4e0._M_dataplus._M_p,local_4e0.field_2._M_allocated_capacity + 1);
  }
  local_4e0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4e0,"lights","");
  local_278._8_8_ = 0;
  pcStack_260 = std::
                _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/patriciogonzalezvivo[P]glslViewer/src/core/sandbox.cpp:660:43)>
                ::_M_invoke;
  local_268 = std::
              _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/patriciogonzalezvivo[P]glslViewer/src/core/sandbox.cpp:660:43)>
              ::_M_manager;
  local_500._M_dataplus._M_p = (pointer)paVar2;
  local_278._M_unused._M_object = this;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_500,"lights","");
  local_520._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_520,"print all light related uniforms","");
  Command::Command(&local_4c0,&local_4e0,
                   (function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                    *)&local_278,&local_500,&local_520,true);
  std::vector<Command,_std::allocator<Command>_>::emplace_back<Command>(_commands,&local_4c0);
  if (local_4c0.exec.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_4c0.exec.super__Function_base._M_manager)
              ((_Any_data *)&local_4c0.exec,(_Any_data *)&local_4c0.exec,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4c0.description._M_dataplus._M_p != &local_4c0.description.field_2) {
    operator_delete(local_4c0.description._M_dataplus._M_p,
                    local_4c0.description.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4c0.formula._M_dataplus._M_p != &local_4c0.formula.field_2) {
    operator_delete(local_4c0.formula._M_dataplus._M_p,
                    local_4c0.formula.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4c0.trigger._M_dataplus._M_p != paVar4) {
    operator_delete(local_4c0.trigger._M_dataplus._M_p,
                    local_4c0.trigger.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_520._M_dataplus._M_p != paVar3) {
    operator_delete(local_520._M_dataplus._M_p,local_520.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_500._M_dataplus._M_p != paVar2) {
    operator_delete(local_500._M_dataplus._M_p,local_500.field_2._M_allocated_capacity + 1);
  }
  if (local_268 != (code *)0x0) {
    (*local_268)(&local_278,&local_278,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4e0._M_dataplus._M_p != paVar1) {
    operator_delete(local_4e0._M_dataplus._M_p,local_4e0.field_2._M_allocated_capacity + 1);
  }
  local_4e0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4e0,"light_position","");
  local_298._8_8_ = 0;
  pcStack_280 = std::
                _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/patriciogonzalezvivo[P]glslViewer/src/core/sandbox.cpp:669:51)>
                ::_M_invoke;
  local_288 = std::
              _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/patriciogonzalezvivo[P]glslViewer/src/core/sandbox.cpp:669:51)>
              ::_M_manager;
  local_500._M_dataplus._M_p = (pointer)paVar2;
  local_298._M_unused._M_object = this;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_500,"light_position[[,<index>],<x>,<y>,<z>]","");
  local_520._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_520,"get or set the light position","");
  Command::Command(&local_4c0,&local_4e0,
                   (function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                    *)&local_298,&local_500,&local_520,true);
  std::vector<Command,_std::allocator<Command>_>::emplace_back<Command>(_commands,&local_4c0);
  if (local_4c0.exec.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_4c0.exec.super__Function_base._M_manager)
              ((_Any_data *)&local_4c0.exec,(_Any_data *)&local_4c0.exec,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4c0.description._M_dataplus._M_p != &local_4c0.description.field_2) {
    operator_delete(local_4c0.description._M_dataplus._M_p,
                    local_4c0.description.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4c0.formula._M_dataplus._M_p != &local_4c0.formula.field_2) {
    operator_delete(local_4c0.formula._M_dataplus._M_p,
                    local_4c0.formula.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4c0.trigger._M_dataplus._M_p != paVar4) {
    operator_delete(local_4c0.trigger._M_dataplus._M_p,
                    local_4c0.trigger.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_520._M_dataplus._M_p != paVar3) {
    operator_delete(local_520._M_dataplus._M_p,local_520.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_500._M_dataplus._M_p != paVar2) {
    operator_delete(local_500._M_dataplus._M_p,local_500.field_2._M_allocated_capacity + 1);
  }
  if (local_288 != (code *)0x0) {
    (*local_288)(&local_298,&local_298,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4e0._M_dataplus._M_p != paVar1) {
    operator_delete(local_4e0._M_dataplus._M_p,local_4e0.field_2._M_allocated_capacity + 1);
  }
  local_4e0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4e0,"light_color","");
  local_2b8._8_8_ = 0;
  pcStack_2a0 = std::
                _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/patriciogonzalezvivo[P]glslViewer/src/core/sandbox.cpp:694:48)>
                ::_M_invoke;
  local_2a8 = std::
              _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/patriciogonzalezvivo[P]glslViewer/src/core/sandbox.cpp:694:48)>
              ::_M_manager;
  local_500._M_dataplus._M_p = (pointer)paVar2;
  local_2b8._M_unused._M_object = this;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_500,"light_color[,<r>,<g>,<b>]","");
  local_520._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_520,"get or set the light color","");
  Command::Command(&local_4c0,&local_4e0,
                   (function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                    *)&local_2b8,&local_500,&local_520,true);
  std::vector<Command,_std::allocator<Command>_>::emplace_back<Command>(_commands,&local_4c0);
  if (local_4c0.exec.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_4c0.exec.super__Function_base._M_manager)
              ((_Any_data *)&local_4c0.exec,(_Any_data *)&local_4c0.exec,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4c0.description._M_dataplus._M_p != &local_4c0.description.field_2) {
    operator_delete(local_4c0.description._M_dataplus._M_p,
                    local_4c0.description.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4c0.formula._M_dataplus._M_p != &local_4c0.formula.field_2) {
    operator_delete(local_4c0.formula._M_dataplus._M_p,
                    local_4c0.formula.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4c0.trigger._M_dataplus._M_p != paVar4) {
    operator_delete(local_4c0.trigger._M_dataplus._M_p,
                    local_4c0.trigger.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_520._M_dataplus._M_p != paVar3) {
    operator_delete(local_520._M_dataplus._M_p,local_520.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_500._M_dataplus._M_p != paVar2) {
    operator_delete(local_500._M_dataplus._M_p,local_500.field_2._M_allocated_capacity + 1);
  }
  if (local_2a8 != (code *)0x0) {
    (*local_2a8)(&local_2b8,&local_2b8,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4e0._M_dataplus._M_p != paVar1) {
    operator_delete(local_4e0._M_dataplus._M_p,local_4e0.field_2._M_allocated_capacity + 1);
  }
  local_4e0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4e0,"light_falloff","");
  local_2d8._8_8_ = 0;
  pcStack_2c0 = std::
                _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/patriciogonzalezvivo[P]glslViewer/src/core/sandbox.cpp:719:50)>
                ::_M_invoke;
  local_2c8 = std::
              _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/patriciogonzalezvivo[P]glslViewer/src/core/sandbox.cpp:719:50)>
              ::_M_manager;
  local_500._M_dataplus._M_p = (pointer)paVar2;
  local_2d8._M_unused._M_object = this;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_500,"light_falloff[,<value>]","")
  ;
  local_520._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_520,"get or set the light falloff distance","");
  Command::Command(&local_4c0,&local_4e0,
                   (function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                    *)&local_2d8,&local_500,&local_520,true);
  std::vector<Command,_std::allocator<Command>_>::emplace_back<Command>(_commands,&local_4c0);
  if (local_4c0.exec.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_4c0.exec.super__Function_base._M_manager)
              ((_Any_data *)&local_4c0.exec,(_Any_data *)&local_4c0.exec,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4c0.description._M_dataplus._M_p != &local_4c0.description.field_2) {
    operator_delete(local_4c0.description._M_dataplus._M_p,
                    local_4c0.description.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4c0.formula._M_dataplus._M_p != &local_4c0.formula.field_2) {
    operator_delete(local_4c0.formula._M_dataplus._M_p,
                    local_4c0.formula.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4c0.trigger._M_dataplus._M_p != paVar4) {
    operator_delete(local_4c0.trigger._M_dataplus._M_p,
                    local_4c0.trigger.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_520._M_dataplus._M_p != paVar3) {
    operator_delete(local_520._M_dataplus._M_p,local_520.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_500._M_dataplus._M_p != paVar2) {
    operator_delete(local_500._M_dataplus._M_p,local_500.field_2._M_allocated_capacity + 1);
  }
  if (local_2c8 != (code *)0x0) {
    (*local_2c8)(&local_2d8,&local_2d8,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4e0._M_dataplus._M_p != paVar1) {
    operator_delete(local_4e0._M_dataplus._M_p,local_4e0.field_2._M_allocated_capacity + 1);
  }
  local_4e0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4e0,"light_intensity","");
  local_2f8._8_8_ = 0;
  pcStack_2e0 = std::
                _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/patriciogonzalezvivo[P]glslViewer/src/core/sandbox.cpp:743:52)>
                ::_M_invoke;
  local_2e8 = std::
              _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/patriciogonzalezvivo[P]glslViewer/src/core/sandbox.cpp:743:52)>
              ::_M_manager;
  local_500._M_dataplus._M_p = (pointer)paVar2;
  local_2f8._M_unused._M_object = this;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_500,"light_intensity[,<value>]","");
  local_520._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_520,"get or set the light intensity","");
  Command::Command(&local_4c0,&local_4e0,
                   (function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                    *)&local_2f8,&local_500,&local_520,true);
  std::vector<Command,_std::allocator<Command>_>::emplace_back<Command>(_commands,&local_4c0);
  if (local_4c0.exec.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_4c0.exec.super__Function_base._M_manager)
              ((_Any_data *)&local_4c0.exec,(_Any_data *)&local_4c0.exec,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4c0.description._M_dataplus._M_p != &local_4c0.description.field_2) {
    operator_delete(local_4c0.description._M_dataplus._M_p,
                    local_4c0.description.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4c0.formula._M_dataplus._M_p != &local_4c0.formula.field_2) {
    operator_delete(local_4c0.formula._M_dataplus._M_p,
                    local_4c0.formula.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4c0.trigger._M_dataplus._M_p != paVar4) {
    operator_delete(local_4c0.trigger._M_dataplus._M_p,
                    local_4c0.trigger.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_520._M_dataplus._M_p != paVar3) {
    operator_delete(local_520._M_dataplus._M_p,local_520.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_500._M_dataplus._M_p != paVar2) {
    operator_delete(local_500._M_dataplus._M_p,local_500.field_2._M_allocated_capacity + 1);
  }
  if (local_2e8 != (code *)0x0) {
    (*local_2e8)(&local_2f8,&local_2f8,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4e0._M_dataplus._M_p != paVar1) {
    operator_delete(local_4e0._M_dataplus._M_p,local_4e0.field_2._M_allocated_capacity + 1);
  }
  local_4e0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4e0,"camera_distance","");
  local_318._8_8_ = 0;
  pcStack_300 = std::
                _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/patriciogonzalezvivo[P]glslViewer/src/core/sandbox.cpp:768:52)>
                ::_M_invoke;
  local_308 = std::
              _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/patriciogonzalezvivo[P]glslViewer/src/core/sandbox.cpp:768:52)>
              ::_M_manager;
  local_500._M_dataplus._M_p = (pointer)paVar2;
  local_318._M_unused._M_object = this;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_500,"camera_distance[,<dist>]","");
  local_520._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_520,"get or set the camera distance to the target","");
  Command::Command(&local_4c0,&local_4e0,
                   (function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                    *)&local_318,&local_500,&local_520,true);
  std::vector<Command,_std::allocator<Command>_>::emplace_back<Command>(_commands,&local_4c0);
  if (local_4c0.exec.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_4c0.exec.super__Function_base._M_manager)
              ((_Any_data *)&local_4c0.exec,(_Any_data *)&local_4c0.exec,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4c0.description._M_dataplus._M_p != &local_4c0.description.field_2) {
    operator_delete(local_4c0.description._M_dataplus._M_p,
                    local_4c0.description.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4c0.formula._M_dataplus._M_p != &local_4c0.formula.field_2) {
    operator_delete(local_4c0.formula._M_dataplus._M_p,
                    local_4c0.formula.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4c0.trigger._M_dataplus._M_p != paVar4) {
    operator_delete(local_4c0.trigger._M_dataplus._M_p,
                    local_4c0.trigger.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_520._M_dataplus._M_p != paVar3) {
    operator_delete(local_520._M_dataplus._M_p,local_520.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_500._M_dataplus._M_p != paVar2) {
    operator_delete(local_500._M_dataplus._M_p,local_500.field_2._M_allocated_capacity + 1);
  }
  if (local_308 != (code *)0x0) {
    (*local_308)(&local_318,&local_318,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4e0._M_dataplus._M_p != paVar1) {
    operator_delete(local_4e0._M_dataplus._M_p,local_4e0.field_2._M_allocated_capacity + 1);
  }
  local_4e0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4e0,"camera_type","");
  local_338._8_8_ = 0;
  pcStack_320 = std::
                _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/patriciogonzalezvivo[P]glslViewer/src/core/sandbox.cpp:786:48)>
                ::_M_invoke;
  local_328 = std::
              _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/patriciogonzalezvivo[P]glslViewer/src/core/sandbox.cpp:786:48)>
              ::_M_manager;
  local_500._M_dataplus._M_p = (pointer)paVar2;
  local_338._M_unused._M_object = this;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_500,"camera_type[,<ortho|perspective>]","");
  local_520._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_520,"get or set the camera type","");
  Command::Command(&local_4c0,&local_4e0,
                   (function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                    *)&local_338,&local_500,&local_520,true);
  std::vector<Command,_std::allocator<Command>_>::emplace_back<Command>(_commands,&local_4c0);
  if (local_4c0.exec.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_4c0.exec.super__Function_base._M_manager)
              ((_Any_data *)&local_4c0.exec,(_Any_data *)&local_4c0.exec,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4c0.description._M_dataplus._M_p != &local_4c0.description.field_2) {
    operator_delete(local_4c0.description._M_dataplus._M_p,
                    local_4c0.description.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4c0.formula._M_dataplus._M_p != &local_4c0.formula.field_2) {
    operator_delete(local_4c0.formula._M_dataplus._M_p,
                    local_4c0.formula.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4c0.trigger._M_dataplus._M_p != paVar4) {
    operator_delete(local_4c0.trigger._M_dataplus._M_p,
                    local_4c0.trigger.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_520._M_dataplus._M_p != paVar3) {
    operator_delete(local_520._M_dataplus._M_p,local_520.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_500._M_dataplus._M_p != paVar2) {
    operator_delete(local_500._M_dataplus._M_p,local_500.field_2._M_allocated_capacity + 1);
  }
  if (local_328 != (code *)0x0) {
    (*local_328)(&local_338,&local_338,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4e0._M_dataplus._M_p != paVar1) {
    operator_delete(local_4e0._M_dataplus._M_p,local_4e0.field_2._M_allocated_capacity + 1);
  }
  local_4e0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4e0,"camera_fov","");
  local_358._8_8_ = 0;
  pcStack_340 = std::
                _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/patriciogonzalezvivo[P]glslViewer/src/core/sandbox.cpp:811:47)>
                ::_M_invoke;
  local_348 = std::
              _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/patriciogonzalezvivo[P]glslViewer/src/core/sandbox.cpp:811:47)>
              ::_M_manager;
  local_500._M_dataplus._M_p = (pointer)paVar2;
  local_358._M_unused._M_object = this;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_500,"camera_fov[,<field_of_view>]","");
  local_520._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_520,"get or set the camera field of view.","");
  Command::Command(&local_4c0,&local_4e0,
                   (function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                    *)&local_358,&local_500,&local_520,true);
  std::vector<Command,_std::allocator<Command>_>::emplace_back<Command>(_commands,&local_4c0);
  if (local_4c0.exec.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_4c0.exec.super__Function_base._M_manager)
              ((_Any_data *)&local_4c0.exec,(_Any_data *)&local_4c0.exec,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4c0.description._M_dataplus._M_p != &local_4c0.description.field_2) {
    operator_delete(local_4c0.description._M_dataplus._M_p,
                    local_4c0.description.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4c0.formula._M_dataplus._M_p != &local_4c0.formula.field_2) {
    operator_delete(local_4c0.formula._M_dataplus._M_p,
                    local_4c0.formula.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4c0.trigger._M_dataplus._M_p != paVar4) {
    operator_delete(local_4c0.trigger._M_dataplus._M_p,
                    local_4c0.trigger.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_520._M_dataplus._M_p != paVar3) {
    operator_delete(local_520._M_dataplus._M_p,local_520.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_500._M_dataplus._M_p != paVar2) {
    operator_delete(local_500._M_dataplus._M_p,local_500.field_2._M_allocated_capacity + 1);
  }
  if (local_348 != (code *)0x0) {
    (*local_348)(&local_358,&local_358,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4e0._M_dataplus._M_p != paVar1) {
    operator_delete(local_4e0._M_dataplus._M_p,local_4e0.field_2._M_allocated_capacity + 1);
  }
  local_4e0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4e0,"camera_position","");
  local_378._8_8_ = 0;
  pcStack_360 = std::
                _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/patriciogonzalezvivo[P]glslViewer/src/core/sandbox.cpp:828:52)>
                ::_M_invoke;
  local_368 = std::
              _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/patriciogonzalezvivo[P]glslViewer/src/core/sandbox.cpp:828:52)>
              ::_M_manager;
  local_500._M_dataplus._M_p = (pointer)paVar2;
  local_378._M_unused._M_object = this;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_500,"camera_position[,<x>,<y>,<z>]","");
  local_520._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_520,"get or set the camera position.","");
  Command::Command(&local_4c0,&local_4e0,
                   (function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                    *)&local_378,&local_500,&local_520,true);
  std::vector<Command,_std::allocator<Command>_>::emplace_back<Command>(_commands,&local_4c0);
  if (local_4c0.exec.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_4c0.exec.super__Function_base._M_manager)
              ((_Any_data *)&local_4c0.exec,(_Any_data *)&local_4c0.exec,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4c0.description._M_dataplus._M_p != &local_4c0.description.field_2) {
    operator_delete(local_4c0.description._M_dataplus._M_p,
                    local_4c0.description.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4c0.formula._M_dataplus._M_p != &local_4c0.formula.field_2) {
    operator_delete(local_4c0.formula._M_dataplus._M_p,
                    local_4c0.formula.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4c0.trigger._M_dataplus._M_p != paVar4) {
    operator_delete(local_4c0.trigger._M_dataplus._M_p,
                    local_4c0.trigger.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_520._M_dataplus._M_p != paVar3) {
    operator_delete(local_520._M_dataplus._M_p,local_520.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_500._M_dataplus._M_p != paVar2) {
    operator_delete(local_500._M_dataplus._M_p,local_500.field_2._M_allocated_capacity + 1);
  }
  if (local_368 != (code *)0x0) {
    (*local_368)(&local_378,&local_378,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4e0._M_dataplus._M_p != paVar1) {
    operator_delete(local_4e0._M_dataplus._M_p,local_4e0.field_2._M_allocated_capacity + 1);
  }
  local_4e0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4e0,"camera_exposure","");
  local_398._8_8_ = 0;
  pcStack_380 = std::
                _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/patriciogonzalezvivo[P]glslViewer/src/core/sandbox.cpp:850:52)>
                ::_M_invoke;
  local_388 = std::
              _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/patriciogonzalezvivo[P]glslViewer/src/core/sandbox.cpp:850:52)>
              ::_M_manager;
  local_500._M_dataplus._M_p = (pointer)paVar2;
  local_398._M_unused._M_object = this;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_500,"camera_exposure[,<aper.>,<shutter>,<sensit.>]","");
  local_520._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_520,"get or set the camera exposure values.","");
  Command::Command(&local_4c0,&local_4e0,
                   (function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                    *)&local_398,&local_500,&local_520,true);
  std::vector<Command,_std::allocator<Command>_>::emplace_back<Command>(_commands,&local_4c0);
  if (local_4c0.exec.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_4c0.exec.super__Function_base._M_manager)
              ((_Any_data *)&local_4c0.exec,(_Any_data *)&local_4c0.exec,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4c0.description._M_dataplus._M_p != &local_4c0.description.field_2) {
    operator_delete(local_4c0.description._M_dataplus._M_p,
                    local_4c0.description.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4c0.formula._M_dataplus._M_p != &local_4c0.formula.field_2) {
    operator_delete(local_4c0.formula._M_dataplus._M_p,
                    local_4c0.formula.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4c0.trigger._M_dataplus._M_p != paVar4) {
    operator_delete(local_4c0.trigger._M_dataplus._M_p,
                    local_4c0.trigger.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_520._M_dataplus._M_p != paVar3) {
    operator_delete(local_520._M_dataplus._M_p,local_520.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_500._M_dataplus._M_p != paVar2) {
    operator_delete(local_500._M_dataplus._M_p,local_500.field_2._M_allocated_capacity + 1);
  }
  if (local_388 != (code *)0x0) {
    (*local_388)(&local_398,&local_398,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4e0._M_dataplus._M_p != paVar1) {
    operator_delete(local_4e0._M_dataplus._M_p,local_4e0.field_2._M_allocated_capacity + 1);
  }
  local_4e0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4e0,"stream","");
  local_3b8._8_8_ = 0;
  pcStack_3a0 = std::
                _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/patriciogonzalezvivo[P]glslViewer/src/core/sandbox.cpp:867:44)>
                ::_M_invoke;
  local_3a8 = std::
              _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/patriciogonzalezvivo[P]glslViewer/src/core/sandbox.cpp:867:44)>
              ::_M_manager;
  local_500._M_dataplus._M_p = (pointer)paVar2;
  local_3b8._M_unused._M_object = this;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_500,"stream,<uniform_name>,stop|play|speed|time[,<value>]","");
  local_520._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_520,"play/stop or change speed or time of a specific stream","");
  Command::Command(&local_4c0,&local_4e0,
                   (function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                    *)&local_3b8,&local_500,&local_520,true);
  std::vector<Command,_std::allocator<Command>_>::emplace_back<Command>(_commands,&local_4c0);
  if (local_4c0.exec.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_4c0.exec.super__Function_base._M_manager)
              ((_Any_data *)&local_4c0.exec,(_Any_data *)&local_4c0.exec,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4c0.description._M_dataplus._M_p != &local_4c0.description.field_2) {
    operator_delete(local_4c0.description._M_dataplus._M_p,
                    local_4c0.description.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4c0.formula._M_dataplus._M_p != &local_4c0.formula.field_2) {
    operator_delete(local_4c0.formula._M_dataplus._M_p,
                    local_4c0.formula.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4c0.trigger._M_dataplus._M_p != paVar4) {
    operator_delete(local_4c0.trigger._M_dataplus._M_p,
                    local_4c0.trigger.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_520._M_dataplus._M_p != paVar3) {
    operator_delete(local_520._M_dataplus._M_p,local_520.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_500._M_dataplus._M_p != paVar2) {
    operator_delete(local_500._M_dataplus._M_p,local_500.field_2._M_allocated_capacity + 1);
  }
  if (local_3a8 != (code *)0x0) {
    (*local_3a8)(&local_3b8,&local_3b8,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4e0._M_dataplus._M_p != paVar1) {
    operator_delete(local_4e0._M_dataplus._M_p,local_4e0.field_2._M_allocated_capacity + 1);
  }
  local_4e0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4e0,"streams","");
  local_3d8._8_8_ = 0;
  pcStack_3c0 = std::
                _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/patriciogonzalezvivo[P]glslViewer/src/core/sandbox.cpp:915:44)>
                ::_M_invoke;
  local_3c8 = std::
              _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/patriciogonzalezvivo[P]glslViewer/src/core/sandbox.cpp:915:44)>
              ::_M_manager;
  local_500._M_dataplus._M_p = (pointer)paVar2;
  local_3d8._M_unused._M_object = this;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_500,"streams[,stop|play|restart|speed|prevs[,<value>]]","");
  local_520._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_520,"print all streams or get/set streams speed and previous frames",
             "");
  Command::Command(&local_4c0,&local_4e0,
                   (function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                    *)&local_3d8,&local_500,&local_520,true);
  std::vector<Command,_std::allocator<Command>_>::emplace_back<Command>(_commands,&local_4c0);
  if (local_4c0.exec.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_4c0.exec.super__Function_base._M_manager)
              ((_Any_data *)&local_4c0.exec,(_Any_data *)&local_4c0.exec,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4c0.description._M_dataplus._M_p != &local_4c0.description.field_2) {
    operator_delete(local_4c0.description._M_dataplus._M_p,
                    local_4c0.description.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4c0.formula._M_dataplus._M_p != &local_4c0.formula.field_2) {
    operator_delete(local_4c0.formula._M_dataplus._M_p,
                    local_4c0.formula.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4c0.trigger._M_dataplus._M_p != paVar4) {
    operator_delete(local_4c0.trigger._M_dataplus._M_p,
                    local_4c0.trigger.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_520._M_dataplus._M_p != paVar3) {
    operator_delete(local_520._M_dataplus._M_p,local_520.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_500._M_dataplus._M_p != paVar2) {
    operator_delete(local_500._M_dataplus._M_p,local_500.field_2._M_allocated_capacity + 1);
  }
  if (local_3c8 != (code *)0x0) {
    (*local_3c8)(&local_3d8,&local_3d8,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4e0._M_dataplus._M_p != paVar1) {
    operator_delete(local_4e0._M_dataplus._M_p,local_4e0.field_2._M_allocated_capacity + 1);
  }
  local_4e0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4e0,"models","");
  local_3f8._8_8_ = 0;
  pcStack_3e0 = std::
                _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/patriciogonzalezvivo[P]glslViewer/src/core/sandbox.cpp:967:43)>
                ::_M_invoke;
  local_3e8 = std::
              _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/patriciogonzalezvivo[P]glslViewer/src/core/sandbox.cpp:967:43)>
              ::_M_manager;
  local_500._M_dataplus._M_p = (pointer)paVar2;
  local_3f8._M_unused._M_object = this;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_500,"models[,clear]","");
  local_520._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_520,"print all or clear all loaded models.","");
  Command::Command(&local_4c0,&local_4e0,
                   (function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                    *)&local_3f8,&local_500,&local_520,true);
  std::vector<Command,_std::allocator<Command>_>::emplace_back<Command>(_commands,&local_4c0);
  if (local_4c0.exec.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_4c0.exec.super__Function_base._M_manager)
              ((_Any_data *)&local_4c0.exec,(_Any_data *)&local_4c0.exec,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4c0.description._M_dataplus._M_p != &local_4c0.description.field_2) {
    operator_delete(local_4c0.description._M_dataplus._M_p,
                    local_4c0.description.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4c0.formula._M_dataplus._M_p != &local_4c0.formula.field_2) {
    operator_delete(local_4c0.formula._M_dataplus._M_p,
                    local_4c0.formula.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4c0.trigger._M_dataplus._M_p != paVar4) {
    operator_delete(local_4c0.trigger._M_dataplus._M_p,
                    local_4c0.trigger.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_520._M_dataplus._M_p != paVar3) {
    operator_delete(local_520._M_dataplus._M_p,local_520.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_500._M_dataplus._M_p != paVar2) {
    operator_delete(local_500._M_dataplus._M_p,local_500.field_2._M_allocated_capacity + 1);
  }
  if (local_3e8 != (code *)0x0) {
    (*local_3e8)(&local_3f8,&local_3f8,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4e0._M_dataplus._M_p != paVar1) {
    operator_delete(local_4e0._M_dataplus._M_p,local_4e0.field_2._M_allocated_capacity + 1);
  }
  local_4e0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4e0,"generate_sdf","");
  local_418._8_8_ = 0;
  pcStack_400 = std::
                _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/patriciogonzalezvivo[P]glslViewer/src/core/sandbox.cpp:986:49)>
                ::_M_invoke;
  local_408 = std::
              _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/patriciogonzalezvivo[P]glslViewer/src/core/sandbox.cpp:986:49)>
              ::_M_manager;
  local_500._M_dataplus._M_p = (pointer)paVar2;
  local_418._M_unused._M_object = this;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_500,"generate_sdf[,padding[,resolution]]","");
  local_520._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_520,
             "create an 3D SDF texture of loaded models, default padding = 0.01, resolution = 6","")
  ;
  Command::Command(&local_4c0,&local_4e0,
                   (function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                    *)&local_418,&local_500,&local_520,true);
  std::vector<Command,_std::allocator<Command>_>::emplace_back<Command>(_commands,&local_4c0);
  if (local_4c0.exec.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_4c0.exec.super__Function_base._M_manager)
              ((_Any_data *)&local_4c0.exec,(_Any_data *)&local_4c0.exec,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4c0.description._M_dataplus._M_p != &local_4c0.description.field_2) {
    operator_delete(local_4c0.description._M_dataplus._M_p,
                    local_4c0.description.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4c0.formula._M_dataplus._M_p != &local_4c0.formula.field_2) {
    operator_delete(local_4c0.formula._M_dataplus._M_p,
                    local_4c0.formula.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4c0.trigger._M_dataplus._M_p != paVar4) {
    operator_delete(local_4c0.trigger._M_dataplus._M_p,
                    local_4c0.trigger.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_520._M_dataplus._M_p != paVar3) {
    operator_delete(local_520._M_dataplus._M_p,local_520.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_500._M_dataplus._M_p != paVar2) {
    operator_delete(local_500._M_dataplus._M_p,local_500.field_2._M_allocated_capacity + 1);
  }
  if (local_408 != (code *)0x0) {
    (*local_408)(&local_418,&local_418,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4e0._M_dataplus._M_p != paVar1) {
    operator_delete(local_4e0._M_dataplus._M_p,local_4e0.field_2._M_allocated_capacity + 1);
  }
  local_4e0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4e0,"max_mem_in_queue","");
  local_438._8_8_ = 0;
  pcStack_420 = std::
                _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/patriciogonzalezvivo[P]glslViewer/src/core/sandbox.cpp:1066:53)>
                ::_M_invoke;
  local_428 = std::
              _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/patriciogonzalezvivo[P]glslViewer/src/core/sandbox.cpp:1066:53)>
              ::_M_manager;
  local_500._M_dataplus._M_p = (pointer)paVar2;
  local_438._M_unused._M_object = this;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_500,"max_mem_in_queue[,<bytes>]","");
  local_520._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_520,
             "set the maximum amount of memory used by a queue to export images to disk","");
  Command::Command(&local_4c0,&local_4e0,
                   (function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                    *)&local_438,&local_500,&local_520,true);
  std::vector<Command,_std::allocator<Command>_>::emplace_back<Command>(_commands,&local_4c0);
  if (local_4c0.exec.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_4c0.exec.super__Function_base._M_manager)
              ((_Any_data *)&local_4c0.exec,(_Any_data *)&local_4c0.exec,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4c0.description._M_dataplus._M_p != &local_4c0.description.field_2) {
    operator_delete(local_4c0.description._M_dataplus._M_p,
                    local_4c0.description.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4c0.formula._M_dataplus._M_p != &local_4c0.formula.field_2) {
    operator_delete(local_4c0.formula._M_dataplus._M_p,
                    local_4c0.formula.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4c0.trigger._M_dataplus._M_p != paVar4) {
    operator_delete(local_4c0.trigger._M_dataplus._M_p,
                    local_4c0.trigger.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_520._M_dataplus._M_p != paVar3) {
    operator_delete(local_520._M_dataplus._M_p,local_520.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_500._M_dataplus._M_p != paVar2) {
    operator_delete(local_500._M_dataplus._M_p,local_500.field_2._M_allocated_capacity + 1);
  }
  if (local_428 != (code *)0x0) {
    (*local_428)(&local_438,&local_438,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4e0._M_dataplus._M_p != paVar1) {
    operator_delete(local_4e0._M_dataplus._M_p,local_4e0.field_2._M_allocated_capacity + 1);
  }
  if ((this->vert_index != -1) || (this->geom_index != -1)) {
    SceneRender::commandsInit(&this->m_sceneRender,_commands,&this->uniforms);
    SceneRender::uniformsInit(&this->m_sceneRender,&this->uniforms);
  }
  return;
}

Assistant:

void Sandbox::commandsInit(CommandList &_commands ) {

    // Add Sandbox Commands
    // ----------------------------------------
    _commands.push_back(Command("debug", [&](const std::string& _line){
        if (_line == "debug") {
            std::string rta = m_showPasses ? "on" : "off";
            std::cout << "buffers," << rta << std::endl; 
            rta = m_showTextures ? "on" : "off";
            std::cout << "textures," << rta << std::endl;
            if (uniforms.models.size() > 0) {
                rta = m_sceneRender.showGrid ? "on" : "off";
                std::cout << "grid," << rta << std::endl; 
                rta = m_sceneRender.showAxis ? "on" : "off";
                std::cout << "axis," << rta << std::endl; 
                rta = m_sceneRender.showBBoxes ? "on" : "off";
                std::cout << "bboxes," << rta << std::endl;
            }
            return true;
        }
        else {
            std::vector<std::string> values = vera::split(_line,',');
            if (values.size() == 2) {
                m_showPasses = (values[1] == "on");
                m_showTextures = (values[1] == "on");
                console_uniforms( values[1] == "on" );
                // m_plot = (values[1] == "on")? 1 : 0;
                if (uniforms.models.size() > 0) {
                    m_sceneRender.showGrid = (values[1] == "on");
                    m_sceneRender.showAxis = (values[1] == "on");
                    m_sceneRender.showBBoxes = (values[1] == "on");
                    if (values[1] == "on")
                        addDefine("DEBUG", values[1]);
                    else
                        delDefine("DEBUG");
                }
                // if (values[1] == "on") {
                //     m_plot = PLOT_FPS;
                //     m_plot_shader.addDefine("PLOT_VALUE", "color.rgb += digits(uv * 0.1 + vec2(0.105, -0.01), value.r * 60.0, 1.0);");
                // }
                // else {
                //     m_plot = PLOT_OFF;
                //     m_plot_shader.delDefine("PLOT_VALUE");
                // }
                return true;
            }
        }
        return false;
    },
    "debug[,on|off]", "show/hide debug elements or return the status of them", false));

    _commands.push_back(Command("track", [&](const std::string& _line){
        if (_line == "track") {
            std::cout << "track," << (uniforms.tracker.isRunning() ? "on" : "off") << std::endl; 
            return true;
        }
        else {
            std::vector<std::string> values = vera::split(_line,',');
            if (values.size() == 2) {

                if ((values[1] == "on" || values[1] == "start" | values[1] == "begin") &&
                    !uniforms.tracker.isRunning() ) 
                    uniforms.tracker.start();
                else if (   (values[1] == "off" || values[1] == "stop" | values[1] == "end") &&
                            uniforms.tracker.isRunning() ) 
                    uniforms.tracker.stop();
                    
                else if (values[1] == "average") 
                    std::cout << uniforms.tracker.logAverage();

                else if (values[1] == "samples")
                    std::cout << uniforms.tracker.logSamples();

                else if (values[1] == "framerate")
                    std::cout << uniforms.tracker.logFramerate();
            }

            else if (values.size() == 3) {

                if (values[1] == "average" && 
                    vera::haveExt(values[2],"csv") ) {
                    std::ofstream out(values[2]);
                    out << uniforms.tracker.logAverage();
                    out.close();
                }

                else if (values[1] == "average")
                    std::cout << uniforms.tracker.logAverage( values[2] );

                else if (   values[1] == "samples" && 
                            vera::haveExt(values[2],"csv") ) {
                    std::ofstream out(values[2]);
                    out << "track,timeStampMs,durationMs\n";
                    out << uniforms.tracker.logSamples();
                    out.close();
                }

                else if (values[1] == "samples")
                    std::cout << uniforms.tracker.logSamples(values[2]);
                    
            }
            else if (values.size() == 4) {

                if (values[1] == "average" && 
                    vera::haveExt(values[3],"csv") ) {
                    std::ofstream out( values[3] );
                    out << uniforms.tracker.logAverage( values[2] );
                    out.close();
                }

                else if (   values[1] == "samples" && 
                    vera::haveExt(values[3],"csv") ) {
                    std::ofstream out( values[3] );
                    out << uniforms.tracker.logSamples( values[2] );
                    out.close();
                }

            }

        }
        return false;
    },
    "track[,on|off|average|samples]", "start/stop tracking rendering time", false));

    _commands.push_back(Command("glsl_version", [&](const std::string& _line){ 
        if (_line == "glsl_version") {
            // Force the output in floats
            std::cout << vera::getVersion() << std::endl;
            return true;
        }
        return false;
    },
    "glsl_version", "return GLSL Version", false));

    _commands.push_back(Command("error_screen", [&](const std::string& _line){ 
        if (_line == "error_screen") {
            std::string rta = (m_error_screen == vera::SHOW_MAGENTA_SHADER) ? "on" : "off";
            std::cout << "error_screen," << rta << std::endl; 
            return true;
        }
        else {
            std::vector<std::string> values = vera::split(_line,',');
            if (values.size() == 2) {
                m_error_screen = (values[1] == "on")? vera::SHOW_MAGENTA_SHADER : vera::REVERT_TO_PREVIOUS_SHADER;
                return true;
            }
        }
        return false;
    },
    "error_screen,on|off", "enable/disable magenta screen on errors", false));

    _commands.push_back(Command("plot", [&](const std::string& _line){
        if (_line == "plot") {
            std::cout << "plot," << plot_options[m_plot] << std::endl; 
            return true;
        }
        else {
            std::vector<std::string> values = vera::split(_line,',');
            if (values[0] == "plot" && values.size() == 2) {
                m_plot_shader.setSource(vera::getDefaultSrc(vera::FRAG_PLOT), vera::getDefaultSrc(vera::VERT_DYNAMIC_BILLBOARD));
                m_plot_shader.delDefine("PLOT_VALUE");

                using plot_value_display_t = std::tuple<std::string, PlotType, std::string>;
                const std::vector<plot_value_display_t> plot_metadata = {
                    {"off", PLOT_OFF, ""}
                    , {"luma", PLOT_LUMA, "color.rgb = vec3(step(st.y, data.a)); color += stroke(fract(st.x * 5.0), 0.5, 0.025) * 0.1;"}
                    , {"red", PLOT_RED, "color.rgb = vec3(step(st.y, data.r), 0.0, 0.0);  color += stroke(fract(st.x * 5.0), 0.5, 0.025) * 0.1;"}
                    , {"green", PLOT_GREEN, "color.rgb = vec3(0.0, step(st.y, data.g), 0.0);  color += stroke(fract(st.x * 5.0), 0.5, 0.025) * 0.1;"}
                    , {"blue", PLOT_BLUE, "color.rgb = vec3(0.0, 0.0, step(st.y, data.b));  color += stroke(fract(st.x * 5.0), 0.5, 0.025) * 0.1;"}
                    , {"rgb", PLOT_RGB, "color += stroke(fract(st.x * 5.0), 0.5, 0.025) * 0.1;"}
                    , {"fps", PLOT_FPS,"color.rgb += digits(uv * 0.1 + vec2(0.0, -0.01), value.r * 60.0, 1.0); color += stroke(fract(st.y * 3.0), 0.5, 0.05) * 0.1;"}
                    , {"ms", PLOT_MS, "color.rgb += digits(uv * 0.1 + vec2(0.105, -0.01), value.r * 60.0, 1.0); color += stroke(fract(st.y * 3.0), 0.5, 0.05) * 0.1;"}
                };

                if (values[1] == "toggle") {
                    auto carousel = std::vector<PlotType>{PLOT_OFF, PLOT_LUMA, PLOT_RGB, PLOT_FPS};
                    const auto it = std::find_if(std::begin(carousel), std::end(carousel), [&](const PlotType& s){return m_plot == s;});
                    if(it != std::end(carousel)) {
                        std::rotate(std::begin(carousel), std::next(it), std::end(carousel));
                        const auto it = std::find_if(std::begin(plot_metadata), std::end(plot_metadata), [&](const plot_value_display_t& s){return carousel.front() == std::get<1>(s);});
                        values[1] = std::get<0>(*it);
                    }
                }

                if (values[1] == "off") 
                    m_plot = PLOT_OFF;
                else {
                    const auto it = std::find_if(std::begin(plot_metadata), std::end(plot_metadata), [&](const plot_value_display_t& i){return std::get<0>(i) == values[1];});
                    if(it != std::end(plot_metadata)) {
                        m_plot = std::get<1>(*it);
                        m_plot_shader.addDefine("PLOT_VALUE", std::get<2>(*it));
                    }
                }
                m_update_buffers = true;
                return true;
            }
        }
        return false;
    },
    "plot[,off|luma|red|green|blue|rgb|fps|ms]", "show/hide a histogram or FPS plot on screen", false));

    _commands.push_back(Command("reset", [&](const std::string& _line){
        if (_line == "reset") {
            m_time_offset = vera::getTime();
            return true;
        }
        return false;
    },
    "reset", "reset timestamp back to zero", false));

    _commands.push_back(Command("time", [&](const std::string& _line){ 
        if (_line == "time") {
            // Force the output in floats
            std::cout << std::setprecision(6) << (vera::getTime() - m_time_offset) << std::endl;
            return true;
        }
        return false;
    },
    "time", "return u_time, the elapsed time.", false));

    _commands.push_back(Command("defines", [&](const std::string& _line){ 
        if (_line == "defines") {
            if (uniforms.models.size() > 0) {
                m_sceneRender.printDefines();
                uniforms.printDefines();
            }
            else
                m_canvas_shader.printDefines();
            
            return true;
        }
        return false;
    },
    "defines", "return a list of active defines", false));
    
    _commands.push_back(Command("uniforms", [&](const std::string& _line){ 
        std::vector<std::string> values = vera::split(_line,',');

        if (values[0] != "uniforms")
            return false;

        if (values.size() == 1) {
            uniforms.printAvailableUniforms(false);
            uniforms.printDefinedUniforms();
            return true;
        }
        else if (values[1] == "all") {
            uniforms.printAvailableUniforms(true);
            uniforms.printDefinedUniforms();
            uniforms.printBuffers();
            uniforms.printTextures();
            uniforms.printStreams();
            uniforms.printCubemaps();
            uniforms.printLights();
            uniforms.printCameras();
            m_sceneRender.printBuffers();
            return true;
        }
        else if (values[1] == "active") {
            uniforms.printAvailableUniforms(false);
            uniforms.printDefinedUniforms();
            return true;
        }
        else if (values[1] == "defined") {
            uniforms.printDefinedUniforms(true);
            return true;
        }
        else if (values[1] == "textures") {
            uniforms.printTextures();
            uniforms.printBuffers();
            m_sceneRender.printBuffers();
            uniforms.printStreams();
            return true;
        }
        else if (values[1] == "buffers") {
            uniforms.printBuffers();
            m_sceneRender.printBuffers();
            return true;
        }
        else if (values[1] == "streams") {
            uniforms.printStreams();
            return true;
        }
        else if (values[1] == "cubemaps") {
            uniforms.printCubemaps();
            return true;
        }
        else if (values[1] == "cameras") {
            uniforms.printCameras();
            return true;
        }
        else if (values[1] == "lights") {
            uniforms.printLights();
            return true;
        }
        else if (values[1] == "on" || values[1] == "off") { 
            console_uniforms( values[1] == "on" );
            return true; 
        }

        return false;
    },
    "uniforms[,all|active|defined|textures|buffers|cubemaps|lights|cameras|on|off]", "return a list of uniforms", false));

    _commands.push_back(Command("textures", [&](const std::string& _line){ 
        if (_line == "textures") {
            uniforms.printTextures();
            uniforms.printStreams();
            return true;
        }
        else {
            std::vector<std::string> values = vera::split(_line,',');
            if (values.size() == 2) {
                if (values[1] == "toggle")
                    values[1] = m_showTextures ? "off" : "on";

                m_showTextures = (values[1] == "on");
                return true;
            }
        }
        return false;
    },
    "textures[,on|off]", "return a list of textures as their uniform name and path. Or show/hide textures on viewport.", false));

    _commands.push_back(Command("buffer", [&](const std::string& _line){ 
        if (_line == "buffers") {
            uniforms.printBuffers();
            m_sceneRender.printBuffers();
            if (m_postprocessing) {
                if (lenticular.size() > 0)
                    std::cout << "LENTICULAR";
                else if (fxaa)
                    std::cout << "FXAA";
                else
                    std::cout << "Custom";
                std::cout << " postProcessing pass" << std::endl;
                return true;
            }
            
            return false;
        }
        else {
            std::vector<std::string> values = vera::split(_line,',');

            if (values.size() == 2) {
                if (values[1] == "toggle")
                    values[1] = m_showPasses ? "off" : "on";

                m_showPasses = (values[1] == "on" || values[1] == "show");
                return true;
            }
            else if (values.size() == 3) {
                size_t i = vera::toInt(values[1]);
                if (i < uniforms.buffers.size())
                    uniforms.buffers[i]->enabled = (values[1] == "on");
            }
        }
        return false;
    },
    "buffers[,show|hide]", "return a list of buffers as their uniform name. Or show/hide buffer on viewport.", false));

    // CUBEMAPS
    _commands.push_back(Command("cubemaps", [&](const std::string& _line){
        if (_line == "cubemaps") {
            uniforms.printCubemaps();
            return true;
        }
        return false;
    },
    "cubemaps", "print all cubemaps"));

    _commands.push_back(Command("cubemap", [&](const std::string& _line){
        if (_line == "cubemaps") {
            uniforms.printCubemaps();
            return true;
        } else if (_line == "cubemap") {
            std::string rta = m_sceneRender.showCubebox ? "on" : "off";
            std::cout << rta << std::endl; 
            return true;
        }
        else {
            std::vector<std::string> values = vera::split(_line,',');
            if (values.size() == 2) {
                if (values[1] == "sh") {
                    uniforms.printCubemapSH();
                    return true;
                }
                if (values[1] == "toggle")
                    values[1] = m_sceneRender.showCubebox ? "off" : "on";

                m_sceneRender.showCubebox = values[1] == "on";
                if (values[1] == "on") {
                    addDefine("SCENE_SH_ARRAY", "u_SH");
                    addDefine("SCENE_CUBEMAP", "u_cubeMap");
                }
                else if (values[1] == "off") {
                    delDefine("SCENE_SH_ARRAY");
                    delDefine("SCENE_CUBEMAP");
                }
                return true;
            }
        }
        return false;
    },
    "cubemap[,on|off|toggle|sh]", "show/hide cubemap or return the spherical harmonics of it"));

    _commands.push_back(Command("sky", [&](const std::string& _line){
        if (_line == "sky") {
            std::string rta = m_sceneRender.showCubebox ? "on" : "off";
            std::cout << rta << std::endl; 
            return true;
        }
        else {
            std::vector<std::string> values = vera::split(_line,',');
            if (values.size() == 2) {
                if (values[1] == "toggle")
                    values[1] = m_sceneRender.showCubebox ? "off" : "on";

                m_sceneRender.showCubebox = values[1] == "on";
                if (values[1] == "on") {
                    uniforms.activeCubemap = uniforms.cubemaps["default"];
                    addDefine("SCENE_SH_ARRAY", "u_SH");
                    addDefine("SCENE_CUBEMAP", "u_cubeMap");
                }
                else if (values[1] == "off") {
                    delDefine("SCENE_SH_ARRAY");
                    delDefine("SCENE_CUBEMAP");
                }
                return true;
            }
        }
        return false;
    },
    "sky[,on|off]", "show/hide skybox"));

    _commands.push_back(Command("sun_elevation", [&](const std::string& _line){ 
        std::vector<std::string> values = vera::split(_line,',');
        if (values.size() == 2) {

            float elevation = glm::radians( vera::toFloat(values[1]) );
            float azimuth = uniforms.getSunAzimuth();

            addDefine("SCENE_SH_ARRAY", "u_SH");
            addDefine("SCENE_CUBEMAP", "u_cubeMap");
            addDefine("SUN", "u_light");
            uniforms.setSunPosition(azimuth, elevation, glm::length( uniforms.lights["default"]->getPosition() ));
            uniforms.activeCubemap = uniforms.cubemaps["default"];
            return true;
        }
        else {
            std::cout << uniforms.getSunElevation() << std::endl;
            return true;
        }
        return false;
    },
    "sun_elevation[,<degrees>]", "get or set the sun elevation in degrees (remember to skybox,on)."));

    _commands.push_back(Command("sun_azimuth", [&](const std::string& _line){ 
        std::vector<std::string> values = vera::split(_line,',');
        if (values.size() == 2) {

            float elevation = uniforms.getSunElevation();
            float azimuth = glm::radians( vera::toFloat(values[1]) );

            addDefine("SUN", "u_light");
            addDefine("SCENE_SH_ARRAY", "u_SH");
            addDefine("SCENE_CUBEMAP", "u_cubeMap");
            uniforms.setSunPosition(azimuth, elevation, glm::length( uniforms.lights["default"]->getPosition() ) );
            uniforms.activeCubemap = uniforms.cubemaps["default"];

            return true;
        }
        else {
            std::cout << uniforms.getSunAzimuth() << std::endl;
            return true;
        }
        return false;
    },
    "sun_azimuth[,<degrees>]", "get or set the sun azimuth in degrees (remember to skybox,on)."));

    _commands.push_back(Command("sky_turbidity", [&](const std::string& _line){ 
        std::vector<std::string> values = vera::split(_line,',');
        if (values.size() == 2) {
            uniforms.setSkyTurbidity( vera::toFloat(values[1]) );
            uniforms.activeCubemap = uniforms.cubemaps["default"];
            return true;
        }
        else {
            std::cout << uniforms.getSkyTurbidity() << std::endl;
            return true;
        }
        return false;
    },
    "sky_turbidity[,<sky_turbidty>]", "get or set the sky turbidity."));

    // LIGTH
    _commands.push_back(Command("lights", [&](const std::string& _line){ 
        if (_line == "lights") {
            uniforms.printLights();
            return true;
        }
        return false;
    },
    "lights", "print all light related uniforms"));

    _commands.push_back(Command("light_position", [&](const std::string& _line){ 
        
        std::vector<std::string> values = vera::split(_line,',');
        if (values.size() == 4) {
            if (uniforms.lights.size() == 1)
                uniforms.setSunPosition( glm::vec3(vera::toFloat(values[1]), vera::toFloat(values[2]), vera::toFloat(values[3])) );
            
            return true;
        }
        // else if (values.size() == 5) {
        //     size_t i = vera::toInt(values[1]);
        //     if (uniforms.lights.size() > i)
        //         uniforms.lights[i].setPosition(glm::vec3(vera::toFloat(values[2]), vera::toFloat(values[3]), vera::toFloat(values[4])));

        //     return true;
        // }
        else {
            glm::vec3 pos = uniforms.lights["default"]->getPosition();
            std::cout << pos.x << ',' << pos.y << ',' << pos.z << std::endl;
            return true;
        }
        return false;
    },
    "light_position[[,<index>],<x>,<y>,<z>]", "get or set the light position"));

    _commands.push_back(Command("light_color", [&](const std::string& _line){ 
        std::vector<std::string> values = vera::split(_line,',');
        if (values.size() == 4) {
            vera::Light* sun = uniforms.lights["default"];
            sun->color = glm::vec3(vera::toFloat(values[1]), vera::toFloat(values[2]), vera::toFloat(values[3]));
            sun->bChange = true;
            return true;
        }
        // else if (values.size() == 5) {
        //     size_t i = vera::toInt(values[1]);
        //     if (uniforms.lights.size() > i) {
        //         uniforms.lights[i].color = glm::vec3(vera::toFloat(values[2]), vera::toFloat(values[3]), vera::toFloat(values[4]));
        //         uniforms.lights[i].bChange = true;
        //     }
        //     return true;
        // }
        else {
            glm::vec3 color = uniforms.lights["default"]->color;
            std::cout << color.x << ',' << color.y << ',' << color.z << std::endl;
            return true;
        }
        return false;
    },
    "light_color[,<r>,<g>,<b>]", "get or set the light color"));

    _commands.push_back(Command("light_falloff", [&](const std::string& _line){ 
         std::vector<std::string> values = vera::split(_line,',');
        if (values.size() == 2) {
            vera::Light* sun = uniforms.lights["default"];
            sun->falloff = vera::toFloat(values[1]);
            sun->bChange = true;
            return true;
        }
        // else if (values.size() == 5) {
        //     size_t i = vera::toInt(values[1]);
        //     if (uniforms.lights.size() > i) {
        //         uniforms.lights[i].falloff = vera::toFloat(values[2]);
        //         uniforms.lights[i].bChange = true;
        //     }
        //     return true;
        // }
        else {
            std::cout << uniforms.lights["default"]->falloff << std::endl;
            return true;
        }
        return false;
    },
    "light_falloff[,<value>]", "get or set the light falloff distance"));

    _commands.push_back(Command("light_intensity", [&](const std::string& _line){ 
         std::vector<std::string> values = vera::split(_line,',');
        if (values.size() == 2) {
            vera::Light* sun = uniforms.lights["default"];
            sun->intensity = vera::toFloat(values[1]);
            sun->bChange = true;
            return true;
        }
        // else if (values.size() == 5) {
        //     size_t i = vera::toInt(values[1]);
        //     if (uniforms.lights.size() > i) {
        //         uniforms.lights[i].intensity = vera::toFloat(values[2]);
        //         uniforms.lights[i].bChange = true;
        //     }
        //     return true;
        // }
        else {
            std::cout <<  uniforms.lights["default"]->intensity << std::endl;
            return true;
        }
        return false;
    },
    "light_intensity[,<value>]", "get or set the light intensity"));

    // CAMERA
    _commands.push_back(Command("camera_distance", [&](const std::string& _line){ 
        if (!uniforms.activeCamera) 
            return false;

        std::vector<std::string> values = vera::split(_line,',');
        if (values.size() == 2) {
            uniforms.activeCamera->setDistance(vera::toFloat(values[1]));
            return true;
        }
        else {
            
            std::cout << uniforms.activeCamera->getDistance() << std::endl;
            return true;
        }
        return false;
    },
    "camera_distance[,<dist>]", "get or set the camera distance to the target"));

    _commands.push_back(Command("camera_type", [&](const std::string& _line){ 
        if (!uniforms.activeCamera) 
            return false;

        std::vector<std::string> values = vera::split(_line,',');
        if (values.size() == 2) {
            if (values[1] == "ortho")
                uniforms.activeCamera->setProjection(vera::ProjectionType::ORTHO);
            else if (values[1] == "perspective")
                uniforms.activeCamera->setProjection(vera::ProjectionType::PERSPECTIVE);
            return true;
        }
        else {
            vera::ProjectionType type = uniforms.activeCamera->getProjectionType();
            if (type == vera::ProjectionType::ORTHO)
                std::cout << "ortho" << std::endl;
            else
                std::cout << "perspective" << std::endl;
            
            return true;
        }
        return false;
    },
    "camera_type[,<ortho|perspective>]", "get or set the camera type"));

    _commands.push_back(Command("camera_fov", [&](const std::string& _line){ 
        if (!uniforms.activeCamera) 
            return false;

        std::vector<std::string> values = vera::split(_line,',');
        if (values.size() == 2) {
            uniforms.activeCamera->setFOV( glm::radians(vera::toFloat(values[1])) );
            return true;
        }
        else {
            std::cout << glm::degrees(uniforms.activeCamera->getFOV()) << std::endl;
            return true;
        }
        return false;
    },
    "camera_fov[,<field_of_view>]", "get or set the camera field of view."));

    _commands.push_back(Command("camera_position", [&](const std::string& _line) {
        if (!uniforms.activeCamera) 
            return false;

        std::vector<std::string> values = vera::split(_line,',');
        if (values.size() == 4) {
            uniforms.activeCamera->setPosition( -glm::vec3(vera::toFloat(values[1]), vera::toFloat(values[2]), vera::toFloat(values[3])));
            uniforms.activeCamera->lookAt( uniforms.activeCamera->getTarget() );
            glm::vec3 v = uniforms.activeCamera->getPosition();
            m_camera_azimuth = glm::degrees( atan2(v.x, v.z) );
            m_camera_elevation = glm::degrees( atan2(-v.y, sqrt(v.x * v.x + v.z * v.z)) );
            return true;
        }
        else {
            glm::vec3 pos = -uniforms.activeCamera->getPosition();
            std::cout << pos.x << ',' << pos.y << ',' << pos.z << std::endl;
            return true;
        }
        return false;
    },
    "camera_position[,<x>,<y>,<z>]", "get or set the camera position."));

    _commands.push_back(Command("camera_exposure", [&](const std::string& _line) { 
        if (!uniforms.activeCamera) 
            return false;

        std::vector<std::string> values = vera::split(_line,',');
        if (values.size() == 4) {
            uniforms.activeCamera->setExposure( vera::toFloat(values[1]), vera::toFloat(values[2]), vera::toFloat(values[3]));
            return true;
        }
        else {
            std::cout << uniforms.activeCamera->getExposure() << std::endl;
            return true;
        }
        return false;
    },
    "camera_exposure[,<aper.>,<shutter>,<sensit.>]", "get or set the camera exposure values."));

     _commands.push_back(Command("stream", [&](const std::string& _line) { 
        std::vector<std::string> values = vera::split(_line,',');

        if (values.size() == 3) {
            if ( values[2] == "play") {
                uniforms.setStreamPlay( values[1] );
                return true;
            }
            else if ( values[2] == "stop") {
                uniforms.setStreamStop( values[1] );
                return true;
            }
            else if ( values[2] == "restart") {
                uniforms.setStreamRestart( values[1] );
                return true;
            }
            else if ( values[2] == "speed") {
                std::cout << uniforms.getStreamSpeed( values[1] ) << std::endl;
                return true;
            }
            else if ( values[2] == "time") {
                std::cout << uniforms.getStreamTime( values[1] ) << std::endl;
                return true;
            }
            else if ( values[2] == "pct") {
                std::cout << uniforms.getStreamPct( values[1] ) << std::endl;
                return true;
            }
        }
        else if (values.size() == 4) {
            if ( values[2] == "speed") {
                uniforms.setStreamSpeed( values[1], vera::toFloat(values[3]) );
                return true;
            }
            else if ( values[2] == "time") {
                uniforms.setStreamTime( values[1], vera::toFloat(values[3]) );
                return true;
            }
            else if ( values[2] == "pct") {
                uniforms.setStreamPct( values[1], vera::toFloat(values[3]) );
                return true;
            }
        }

        return false;
    },
    "stream,<uniform_name>,stop|play|speed|time[,<value>]", "play/stop or change speed or time of a specific stream"));

    _commands.push_back(Command("streams", [&](const std::string& _line){ 
        std::vector<std::string> values = vera::split(_line,',');

        if (_line == "streams")
            uniforms.printStreams();

        else if (values.size() == 2) {
            if ( values[1] == "stop") {
                uniforms.setStreamsStop();
                return true;
            }
            else if ( values[1] == "play") {
                uniforms.setStreamsPlay();
                return true;
            }
            else if ( values[1] == "restart") {
                uniforms.setStreamsRestart();
                return true;
            }
        }
        else if (values.size() == 3) {
            if ( values[1] == "speed") {
                uniforms.setStreamsSpeed( vera::toFloat(values[2]) );
                return true;
            }
            else if ( values[1] == "time") {
                uniforms.setStreamsTime( vera::toFloat(values[2]) );
                return true;
            }
            else if ( values[1] == "pct") {
                uniforms.setStreamsPct( vera::toFloat(values[2]) );
                return true;
            }
            else if ( values[1] == "prevs") {
                int prevs = vera::toInt(values[2]);

                if (prevs == 0) {
                    uniforms.setStreamsPrevs( 0 );
                    delDefine("STREAMS_PREVS");
                }
                else {
                    uniforms.setStreamsPrevs( vera::toInt(values[2]) );
                    addDefine("STREAMS_PREVS", values[2]);
                }
                return true;
            }
        }

        return false;
    },
    "streams[,stop|play|restart|speed|prevs[,<value>]]", "print all streams or get/set streams speed and previous frames"));

    _commands.push_back(Command("models", [&](const std::string& _line){ 
        std::vector<std::string> values = vera::split(_line,',');

        if (_line == "models") {
            uniforms.printModels();
            return true;
        }
        else if (values.size() == 2) {
            if ( values[1] == "clear") {
                uniforms.clearModels();
                m_sceneRender.clearScene();
                return true;
            }
        }
        
        return false;
    },
    "models[,clear]", "print all or clear all loaded models."));

    _commands.push_back(Command("generate_sdf", [&](const std::string& _line) { 
        if (geom_index != -1) {
            std::vector<std::string> values = vera::split(_line,',');
            float padding = 0.01f;
            if (values.size() > 1)
                padding = vera::toFloat(values[1]);

            for (vera::ModelsMap::iterator it = uniforms.models.begin(); it != uniforms.models.end(); ++it) {
                std::string name = "u_" + it->first + "Sdf";
                addDefine("MODEL_SDF_TEXTURE", name );

                clock_t start, end;
                start = clock();

                vera::Mesh mesh = it->second->mesh;
                mesh.setMaterial(it->second->mesh.getMaterial());
                vera::center(mesh);
                
                std::vector<vera::Triangle> tris = mesh.getTriangles();
                vera::BVH acc(tris, vera::SPLIT_MIDPOINT );
                acc.square();

                // // Calculate scale difference between model and SDF
                // vera::BoundingBox bbox  = it->second->getBoundingBox();
                // float area = bbox.getArea();
                // glm::vec3   bdiagonal   = bbox.getDiagonal();
                // float       max_dist    = glm::length(bdiagonal);
                // bbox.expand( (max_dist*max_dist) * padding );
                // it->second->addDefine("MODEL_SDF_SCALE", vera::toString(2.0f-bbox.getArea()/area) );

                int voxel_resolution_lod_0  = std::pow(2, 2);
                glm::vec3   bdiagonal       = acc.getDiagonal();
                float       max_dist        = glm::length(bdiagonal);
                acc.expand( (max_dist*max_dist) * padding );

                std::vector<vera::Image> current_lod;
                for (int z = 0; z < voxel_resolution_lod_0; z++)
                    current_lod.push_back( vera::toSdfLayer( &acc, voxel_resolution_lod_0, z) );
                
                uniforms.loadMutex.lock();
                uniforms.loadQueue[ name ] = packSprite(current_lod);
                uniforms.loadMutex.unlock();
                addDefine("MODEL_SDF_VOXEL_RESOLUTION", vera::toString(voxel_resolution_lod_0) + ".0" );
                addDefine("MODEL_SDF_TEXTURE_RESOLUTION", "vec2(" + vera::toString( uniforms.loadQueue[ name ].getWidth() ) + ".0)" );

                size_t lod_total = 4;
                for (int l = 1; l < lod_total; l++) {
                    std::vector<vera::Image> new_lod = vera::scaleSprite(current_lod, 4);
                    uniforms.loadMutex.lock();
                    uniforms.loadQueue[ name ] = vera::packSprite(new_lod);
                    uniforms.loadMutex.unlock();
                    addDefine("MODEL_SDF_VOXEL_RESOLUTION", vera::toString(new_lod.size()) + ".0" );
                    addDefine("MODEL_SDF_TEXTURE_RESOLUTION", "vec2(" + vera::toString( uniforms.loadQueue[ name ].getWidth() ) + ".0)" );

                    if (l < (lod_total-1)) {
                        for (int z = 0; z < new_lod.size(); z++) {
                            new_lod[z] = vera::toSdfLayer( &acc, new_lod.size(), z);
                            console_draw_pct( float(z) / float(new_lod.size() - 1) );
                            uniforms.loadMutex.lock();
                            uniforms.loadQueue[ name ] = vera::packSprite(new_lod);
                            uniforms.loadMutex.unlock();
                        }
                    }
                    
                    current_lod = new_lod;
                }

                end = clock();
                double duration_sec = double(end-start)/CLOCKS_PER_SEC;
                std::cout << "Took " << duration_sec << "secs" << std::endl;
            }

            return true;
        }
        return false;
    },
    "generate_sdf[,padding[,resolution]]", "create an 3D SDF texture of loaded models, default padding = 0.01, resolution = 6"));


    #if defined(SUPPORT_MULTITHREAD_RECORDING)
    _commands.push_back(Command("max_mem_in_queue", [&](const std::string & line) {
        std::vector<std::string> values = vera::split(line,',');
        if (values.size() == 2) {
            m_max_mem_in_queue = std::stoll(values[1]);
        }
        else {
            std::cout << m_max_mem_in_queue.load() << std::endl;
        }
        return false;
    }, "max_mem_in_queue[,<bytes>]", "set the maximum amount of memory used by a queue to export images to disk"));
    #endif

    if (vert_index != -1 || geom_index != -1) {
        m_sceneRender.commandsInit(_commands, uniforms);
        m_sceneRender.uniformsInit(uniforms);
    }
}